

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long lVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar74 [32];
  float fVar75;
  byte bVar76;
  ulong uVar77;
  long lVar78;
  uint uVar79;
  uint uVar80;
  long lVar81;
  long lVar82;
  Geometry *pGVar83;
  uint uVar84;
  ulong uVar85;
  byte bVar86;
  ulong uVar87;
  float fVar88;
  float fVar89;
  float fVar138;
  float fVar140;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar98 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar99 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined4 uVar144;
  float fVar159;
  float fVar160;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar161;
  undefined1 auVar158 [64];
  float fVar162;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  vint4 bi;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar190;
  float fVar191;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar193;
  undefined1 auVar186 [32];
  float fVar192;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 ai_2;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  vint4 ai;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  float fVar213;
  float fVar214;
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_858;
  undefined1 (*local_828) [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [64];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined4 local_5c0;
  int local_5bc;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_560 [4];
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar224 [32];
  
  PVar5 = prim[1];
  uVar87 = (ulong)(byte)PVar5;
  fVar166 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar94 = vsubps_avx(auVar94,*(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  auVar180._0_4_ = fVar166 * auVar94._0_4_;
  auVar180._4_4_ = fVar166 * auVar94._4_4_;
  auVar180._8_4_ = fVar166 * auVar94._8_4_;
  auVar180._12_4_ = fVar166 * auVar94._12_4_;
  auVar145._0_4_ = fVar166 * auVar92._0_4_;
  auVar145._4_4_ = fVar166 * auVar92._4_4_;
  auVar145._8_4_ = fVar166 * auVar92._8_4_;
  auVar145._12_4_ = fVar166 * auVar92._12_4_;
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar87 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  uVar85 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar87 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  uVar77 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar218._4_4_ = auVar145._0_4_;
  auVar218._0_4_ = auVar145._0_4_;
  auVar218._8_4_ = auVar145._0_4_;
  auVar218._12_4_ = auVar145._0_4_;
  auVar29 = vshufps_avx(auVar145,auVar145,0x55);
  auVar93 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar166 = auVar93._0_4_;
  auVar167._0_4_ = fVar166 * auVar97._0_4_;
  fVar159 = auVar93._4_4_;
  auVar167._4_4_ = fVar159 * auVar97._4_4_;
  fVar160 = auVar93._8_4_;
  auVar167._8_4_ = fVar160 * auVar97._8_4_;
  fVar161 = auVar93._12_4_;
  auVar167._12_4_ = fVar161 * auVar97._12_4_;
  auVar99._0_4_ = auVar25._0_4_ * fVar166;
  auVar99._4_4_ = auVar25._4_4_ * fVar159;
  auVar99._8_4_ = auVar25._8_4_ * fVar160;
  auVar99._12_4_ = auVar25._12_4_ * fVar161;
  auVar96._0_4_ = auVar28._0_4_ * fVar166;
  auVar96._4_4_ = auVar28._4_4_ * fVar159;
  auVar96._8_4_ = auVar28._8_4_ * fVar160;
  auVar96._12_4_ = auVar28._12_4_ * fVar161;
  auVar93 = vfmadd231ps_fma(auVar167,auVar29,auVar92);
  auVar91 = vfmadd231ps_fma(auVar99,auVar29,auVar24);
  auVar29 = vfmadd231ps_fma(auVar96,auVar27,auVar29);
  auVar90 = vfmadd231ps_fma(auVar93,auVar218,auVar94);
  auVar91 = vfmadd231ps_fma(auVar91,auVar218,auVar95);
  auVar145 = vfmadd231ps_fma(auVar29,auVar26,auVar218);
  auVar219._4_4_ = auVar180._0_4_;
  auVar219._0_4_ = auVar180._0_4_;
  auVar219._8_4_ = auVar180._0_4_;
  auVar219._12_4_ = auVar180._0_4_;
  auVar29 = vshufps_avx(auVar180,auVar180,0x55);
  auVar93 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar166 = auVar93._0_4_;
  auVar222._0_4_ = fVar166 * auVar97._0_4_;
  fVar159 = auVar93._4_4_;
  auVar222._4_4_ = fVar159 * auVar97._4_4_;
  fVar160 = auVar93._8_4_;
  auVar222._8_4_ = fVar160 * auVar97._8_4_;
  fVar161 = auVar93._12_4_;
  auVar222._12_4_ = fVar161 * auVar97._12_4_;
  auVar194._0_4_ = auVar25._0_4_ * fVar166;
  auVar194._4_4_ = auVar25._4_4_ * fVar159;
  auVar194._8_4_ = auVar25._8_4_ * fVar160;
  auVar194._12_4_ = auVar25._12_4_ * fVar161;
  auVar181._0_4_ = auVar28._0_4_ * fVar166;
  auVar181._4_4_ = auVar28._4_4_ * fVar159;
  auVar181._8_4_ = auVar28._8_4_ * fVar160;
  auVar181._12_4_ = auVar28._12_4_ * fVar161;
  auVar92 = vfmadd231ps_fma(auVar222,auVar29,auVar92);
  auVar97 = vfmadd231ps_fma(auVar194,auVar29,auVar24);
  auVar24 = vfmadd231ps_fma(auVar181,auVar29,auVar27);
  auVar25 = vfmadd231ps_fma(auVar92,auVar219,auVar94);
  auVar27 = vfmadd231ps_fma(auVar97,auVar219,auVar95);
  auVar210._8_4_ = 0x7fffffff;
  auVar210._0_8_ = 0x7fffffff7fffffff;
  auVar210._12_4_ = 0x7fffffff;
  auVar28 = vfmadd231ps_fma(auVar24,auVar219,auVar26);
  auVar94 = vandps_avx(auVar90,auVar210);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  uVar85 = vcmpps_avx512vl(auVar94,auVar207,1);
  bVar10 = (bool)((byte)uVar85 & 1);
  auVar93._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._0_4_;
  bVar10 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._4_4_;
  bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._8_4_;
  bVar10 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar90._12_4_;
  auVar94 = vandps_avx(auVar91,auVar210);
  uVar85 = vcmpps_avx512vl(auVar94,auVar207,1);
  bVar10 = (bool)((byte)uVar85 & 1);
  auVar90._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._0_4_;
  bVar10 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._4_4_;
  bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._8_4_;
  bVar10 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar91._12_4_;
  auVar94 = vandps_avx(auVar145,auVar210);
  uVar85 = vcmpps_avx512vl(auVar94,auVar207,1);
  bVar10 = (bool)((byte)uVar85 & 1);
  auVar91._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar145._0_4_;
  bVar10 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar145._4_4_;
  bVar10 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar145._8_4_;
  bVar10 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar145._12_4_;
  auVar92 = vrcp14ps_avx512vl(auVar93);
  auVar208._8_4_ = 0x3f800000;
  auVar208._0_8_ = 0x3f8000003f800000;
  auVar208._12_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar93,auVar92,auVar208);
  auVar95 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar94 = vfnmadd213ps_fma(auVar90,auVar92,auVar208);
  auVar24 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar91);
  auVar94 = vfnmadd213ps_fma(auVar91,auVar92,auVar208);
  auVar26 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar94);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar25);
  auVar201._0_4_ = auVar95._0_4_ * auVar94._0_4_;
  auVar201._4_4_ = auVar95._4_4_ * auVar94._4_4_;
  auVar201._8_4_ = auVar95._8_4_ * auVar94._8_4_;
  auVar201._12_4_ = auVar95._12_4_ * auVar94._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar94 = vpmovsxwd_avx(auVar92);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar25);
  auVar93 = vpbroadcastd_avx512vl();
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar92 = vpmovsxwd_avx(auVar97);
  auVar168._0_4_ = auVar95._0_4_ * auVar94._0_4_;
  auVar168._4_4_ = auVar95._4_4_ * auVar94._4_4_;
  auVar168._8_4_ = auVar95._8_4_ * auVar94._8_4_;
  auVar168._12_4_ = auVar95._12_4_ * auVar94._12_4_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar87 * -2 + 6);
  auVar94 = vpmovsxwd_avx(auVar95);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar27);
  auVar209._0_4_ = auVar24._0_4_ * auVar94._0_4_;
  auVar209._4_4_ = auVar24._4_4_ * auVar94._4_4_;
  auVar209._8_4_ = auVar24._8_4_ * auVar94._8_4_;
  auVar209._12_4_ = auVar24._12_4_ * auVar94._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar92);
  auVar94 = vsubps_avx(auVar94,auVar27);
  auVar163._0_4_ = auVar24._0_4_ * auVar94._0_4_;
  auVar163._4_4_ = auVar24._4_4_ * auVar94._4_4_;
  auVar163._8_4_ = auVar24._8_4_ * auVar94._8_4_;
  auVar163._12_4_ = auVar24._12_4_ * auVar94._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar77 + uVar87 + 6);
  auVar94 = vpmovsxwd_avx(auVar24);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar28);
  auVar195._0_4_ = auVar26._0_4_ * auVar94._0_4_;
  auVar195._4_4_ = auVar26._4_4_ * auVar94._4_4_;
  auVar195._8_4_ = auVar26._8_4_ * auVar94._8_4_;
  auVar195._12_4_ = auVar26._12_4_ * auVar94._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar94 = vpmovsxwd_avx(auVar25);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar28);
  auVar98._0_4_ = auVar26._0_4_ * auVar94._0_4_;
  auVar98._4_4_ = auVar26._4_4_ * auVar94._4_4_;
  auVar98._8_4_ = auVar26._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar26._12_4_ * auVar94._12_4_;
  auVar94 = vpminsd_avx(auVar201,auVar168);
  auVar92 = vpminsd_avx(auVar209,auVar163);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar92 = vpminsd_avx(auVar195,auVar98);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar26._4_4_ = uVar144;
  auVar26._0_4_ = uVar144;
  auVar26._8_4_ = uVar144;
  auVar26._12_4_ = uVar144;
  auVar92 = vmaxps_avx512vl(auVar92,auVar26);
  auVar94 = vmaxps_avx(auVar94,auVar92);
  auVar27._8_4_ = 0x3f7ffffa;
  auVar27._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar27._12_4_ = 0x3f7ffffa;
  local_4f0 = vmulps_avx512vl(auVar94,auVar27);
  auVar94 = vpmaxsd_avx(auVar201,auVar168);
  auVar92 = vpmaxsd_avx(auVar209,auVar163);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar92 = vpmaxsd_avx(auVar195,auVar98);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar28._4_4_ = uVar144;
  auVar28._0_4_ = uVar144;
  auVar28._8_4_ = uVar144;
  auVar28._12_4_ = uVar144;
  auVar92 = vminps_avx512vl(auVar92,auVar28);
  auVar94 = vminps_avx(auVar94,auVar92);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar29);
  uVar30 = vcmpps_avx512vl(local_4f0,auVar94,2);
  uVar85 = vpcmpgtd_avx512vl(auVar93,_DAT_01f7fcf0);
  uVar85 = ((byte)uVar30 & 0xf) & uVar85;
  if ((char)uVar85 != '\0') {
    local_828 = (undefined1 (*) [32])local_100;
    auVar158 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar158);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar158 = ZEXT3264(auVar100);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar229 = ZEXT3264(auVar100);
    do {
      lVar82 = 0;
      for (uVar77 = uVar85; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar82 = lVar82 + 1;
      }
      uVar84 = *(uint *)(prim + 2);
      uVar6 = *(uint *)(prim + lVar82 * 4 + 6);
      pGVar83 = (context->scene->geometries).items[uVar84].ptr;
      uVar77 = (ulong)*(uint *)(*(long *)&pGVar83->field_0x58 +
                               (ulong)uVar6 *
                               pGVar83[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar78 = (long)pGVar83[1].intersectionFilterN * uVar77;
      lVar82 = *(long *)&pGVar83[1].time_range.upper;
      auVar94 = *(undefined1 (*) [16])(lVar82 + lVar78);
      lVar81 = (long)pGVar83[1].intersectionFilterN * (uVar77 + 1);
      auVar92 = *(undefined1 (*) [16])(lVar82 + lVar81);
      iVar7 = (int)pGVar83[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar60 = (long)iVar7 * 0x44;
      auVar169._8_4_ = 0xbeaaaaab;
      auVar169._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar169._12_4_ = 0xbeaaaaab;
      auVar145 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar83[2].intersectionFilterN +
                                   uVar77 * (long)pGVar83[2].pointQueryFunc),auVar94,auVar169);
      auVar25 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar83[2].intersectionFilterN +
                                 (long)pGVar83[2].pointQueryFunc * (uVar77 + 1)),auVar92,auVar169);
      auVar24 = vsubps_avx(auVar94,auVar97);
      uVar144 = auVar24._0_4_;
      auVar170._4_4_ = uVar144;
      auVar170._0_4_ = uVar144;
      auVar170._8_4_ = uVar144;
      auVar170._12_4_ = uVar144;
      auVar95 = vshufps_avx(auVar24,auVar24,0x55);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar166 = pre->ray_space[k].vz.field_0.m128[0];
      fVar159 = pre->ray_space[k].vz.field_0.m128[1];
      fVar160 = pre->ray_space[k].vz.field_0.m128[2];
      fVar161 = pre->ray_space[k].vz.field_0.m128[3];
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar216._0_4_ = fVar166 * auVar24._0_4_;
      auVar216._4_4_ = fVar159 * auVar24._4_4_;
      auVar216._8_4_ = fVar160 * auVar24._8_4_;
      auVar216._12_4_ = fVar161 * auVar24._12_4_;
      auVar95 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar4,auVar95);
      auVar26 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar170);
      auVar24 = vsubps_avx(auVar145,auVar97);
      uVar144 = auVar24._0_4_;
      auVar171._4_4_ = uVar144;
      auVar171._0_4_ = uVar144;
      auVar171._8_4_ = uVar144;
      auVar171._12_4_ = uVar144;
      auVar95 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar217._0_4_ = fVar166 * auVar24._0_4_;
      auVar217._4_4_ = fVar159 * auVar24._4_4_;
      auVar217._8_4_ = fVar160 * auVar24._8_4_;
      auVar217._12_4_ = fVar161 * auVar24._12_4_;
      auVar95 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar4,auVar95);
      auVar27 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar171);
      auVar24 = vsubps_avx(auVar25,auVar97);
      uVar144 = auVar24._0_4_;
      auVar172._4_4_ = uVar144;
      auVar172._0_4_ = uVar144;
      auVar172._8_4_ = uVar144;
      auVar172._12_4_ = uVar144;
      auVar95 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar220._0_4_ = fVar166 * auVar24._0_4_;
      auVar220._4_4_ = fVar159 * auVar24._4_4_;
      auVar220._8_4_ = fVar160 * auVar24._8_4_;
      auVar220._12_4_ = fVar161 * auVar24._12_4_;
      auVar95 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar4,auVar95);
      auVar24 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar172);
      auVar95 = vsubps_avx(auVar92,auVar97);
      uVar144 = auVar95._0_4_;
      auVar164._4_4_ = uVar144;
      auVar164._0_4_ = uVar144;
      auVar164._8_4_ = uVar144;
      auVar164._12_4_ = uVar144;
      auVar97 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar223._0_4_ = fVar166 * auVar95._0_4_;
      auVar223._4_4_ = fVar159 * auVar95._4_4_;
      auVar223._8_4_ = fVar160 * auVar95._8_4_;
      auVar223._12_4_ = fVar161 * auVar95._12_4_;
      auVar97 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar4,auVar97);
      auVar28 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar3,auVar164);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar60);
      uVar144 = auVar26._0_4_;
      local_640._4_4_ = uVar144;
      local_640._0_4_ = uVar144;
      local_640._8_4_ = uVar144;
      local_640._12_4_ = uVar144;
      local_640._16_4_ = uVar144;
      local_640._20_4_ = uVar144;
      local_640._24_4_ = uVar144;
      local_640._28_4_ = uVar144;
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x484);
      auVar101 = auVar158._0_32_;
      local_660 = vpermps_avx512vl(auVar101,ZEXT1632(auVar26));
      local_680 = vbroadcastss_avx512vl(auVar27);
      local_6a0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar27));
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x908);
      local_6c0 = vbroadcastss_avx512vl(auVar24);
      local_6e0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar24));
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0xd8c);
      uVar144 = auVar28._0_4_;
      local_700._4_4_ = uVar144;
      local_700._0_4_ = uVar144;
      fStack_6f8 = (float)uVar144;
      fStack_6f4 = (float)uVar144;
      fStack_6f0 = (float)uVar144;
      fStack_6ec = (float)uVar144;
      fStack_6e8 = (float)uVar144;
      register0x0000139c = uVar144;
      _local_720 = vpermps_avx512vl(auVar101,ZEXT1632(auVar28));
      auVar101 = vmulps_avx512vl(_local_700,auVar112);
      auVar102 = vmulps_avx512vl(_local_720,auVar112);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,local_6c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,local_6e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_680);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar114,local_6a0);
      auVar29 = vfmadd231ps_fma(auVar101,auVar100,local_640);
      auVar206 = ZEXT1664(auVar29);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar60);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x484);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x908);
      auVar93 = vfmadd231ps_fma(auVar103,auVar100,local_660);
      auVar200 = ZEXT1664(auVar93);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0xd8c);
      auVar104 = vmulps_avx512vl(_local_700,auVar103);
      auVar105 = vmulps_avx512vl(_local_720,auVar103);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_6c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,local_6e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_680);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_6a0);
      auVar91 = vfmadd231ps_fma(auVar104,auVar101,local_640);
      auVar211 = ZEXT1664(auVar91);
      auVar90 = vfmadd231ps_fma(auVar105,auVar101,local_660);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar29));
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar93));
      auVar106 = vmulps_avx512vl(ZEXT1632(auVar93),auVar104);
      auVar107 = vmulps_avx512vl(ZEXT1632(auVar29),auVar105);
      auVar106 = vsubps_avx512vl(auVar106,auVar107);
      auVar97 = vshufps_avx(auVar145,auVar145,0xff);
      local_320 = vbroadcastsd_avx512vl(auVar97);
      auVar97 = vshufps_avx(auVar25,auVar25,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar97);
      local_360 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar82 + 0xc + lVar81)));
      auVar107 = vmulps_avx512vl(local_360,auVar112);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_340);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_320);
      local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar82 + 0xc + lVar78)));
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_380);
      auVar108 = vmulps_avx512vl(local_360,auVar103);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_340);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,local_320);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,local_380);
      auVar109 = vmulps_avx512vl(auVar105,auVar105);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar104,auVar104);
      auVar110 = vmaxps_avx512vl(auVar107,auVar108);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      uVar30 = vcmpps_avx512vl(auVar106,auVar109,2);
      auVar97 = vinsertps_avx512f(auVar26,local_380._0_16_,0x30);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar96 = vandps_avx512vl(auVar97,auVar95);
      auVar97 = vblendps_avx(auVar27,auVar145,8);
      auVar97 = vandps_avx512vl(auVar97,auVar95);
      auVar96 = vmaxps_avx512vl(auVar96,auVar97);
      auVar97 = vblendps_avx(auVar24,auVar25,8);
      auVar98 = vandps_avx512vl(auVar97,auVar95);
      auVar97 = vinsertps_avx512f(auVar28,local_360._0_16_,0x30);
      auVar97 = vandps_avx512vl(auVar97,auVar95);
      auVar97 = vmaxps_avx512vl(auVar98,auVar97);
      auVar97 = vmaxps_avx(auVar96,auVar97);
      auVar95 = vmovshdup_avx(auVar97);
      auVar95 = vmaxss_avx(auVar95,auVar97);
      auVar97 = vshufpd_avx(auVar97,auVar97,1);
      auVar97 = vmaxss_avx(auVar97,auVar95);
      auVar95 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar7);
      local_440._0_16_ = auVar95;
      auVar106._0_4_ = auVar95._0_4_;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106._16_4_ = auVar106._0_4_;
      auVar106._20_4_ = auVar106._0_4_;
      auVar106._24_4_ = auVar106._0_4_;
      auVar106._28_4_ = auVar106._0_4_;
      uVar31 = vcmpps_avx512vl(auVar106,_DAT_01faff40,0xe);
      bVar86 = (byte)uVar30 & (byte)uVar31;
      fVar166 = auVar97._0_4_ * 4.7683716e-07;
      local_800._0_16_ = ZEXT416((uint)fVar166);
      auVar109 = auVar229._0_32_;
      local_7e0 = vpermps_avx512vl(auVar109,ZEXT1632(auVar26));
      auVar228 = ZEXT3264(local_7e0);
      local_4a0 = vpermps_avx512vl(auVar109,ZEXT1632(auVar27));
      local_4c0 = vpermps_avx512vl(auVar109,ZEXT1632(auVar24));
      local_4e0 = vpermps_avx512vl(auVar109,ZEXT1632(auVar28));
      local_7a0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_79c = 0;
      uStack_798 = 0;
      uStack_794 = 0;
      local_880 = auVar94._0_8_;
      uStack_878 = auVar94._8_8_;
      local_870 = auVar145._0_8_;
      uStack_868 = auVar145._8_8_;
      local_8a0 = auVar25._0_8_;
      uStack_898 = auVar25._8_8_;
      local_890._0_4_ = auVar92._0_4_;
      fVar159 = (float)local_890;
      local_890._4_4_ = auVar92._4_4_;
      fVar160 = local_890._4_4_;
      uStack_888._0_4_ = auVar92._8_4_;
      fVar161 = (float)uStack_888;
      uStack_888._4_4_ = auVar92._12_4_;
      fVar75 = uStack_888._4_4_;
      local_890 = auVar92._0_8_;
      uStack_888 = auVar92._8_8_;
      if (bVar86 != 0) {
        in_ZMM25 = ZEXT3264(local_4e0);
        auVar103 = vmulps_avx512vl(local_4e0,auVar103);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_4c0,auVar103);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar111);
        auVar111 = vfmadd213ps_avx512vl(auVar101,local_7e0,auVar102);
        auVar112 = vmulps_avx512vl(local_4e0,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_4c0,auVar112);
        auVar102 = vfmadd213ps_avx512vl(auVar114,local_4a0,auVar113);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x1210);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x1694);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar60 + 0x1f9c);
        auVar103 = vfmadd213ps_avx512vl(auVar100,local_7e0,auVar102);
        auVar100 = vmulps_avx512vl(_local_700,auVar101);
        auVar102 = vmulps_avx512vl(_local_720,auVar101);
        auVar101 = vmulps_avx512vl(local_4e0,auVar101);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,local_6c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,local_6e0);
        auVar112 = vfmadd231ps_avx512vl(auVar101,local_4c0,auVar112);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar113,local_680);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar113,local_6a0);
        auVar102 = vfmadd231ps_avx512vl(auVar112,local_4a0,auVar113);
        auVar109 = vfmadd231ps_avx512vl(auVar100,auVar114,local_640);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_660);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x1210);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x1b18);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x1f9c);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_7e0,auVar114);
        auVar114 = vmulps_avx512vl(_local_700,auVar112);
        auVar110 = vmulps_avx512vl(_local_720,auVar112);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar229 = ZEXT3264(auVar115);
        auVar112 = vmulps_avx512vl(local_4e0,auVar112);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar113,local_6c0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_6e0);
        auVar113 = vfmadd231ps_avx512vl(auVar112,local_4c0,auVar113);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar60 + 0x1694);
        auVar112 = vfmadd231ps_avx512vl(auVar115,auVar114,local_680);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_6a0);
        auVar114 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar112,auVar100,local_640);
        auVar112 = vfmadd231ps_avx512vl(auVar110,auVar100,local_660);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_7e0,auVar100);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar109,auVar110);
        vandps_avx512vl(auVar101,auVar110);
        auVar100 = vmaxps_avx(auVar110,auVar110);
        vandps_avx512vl(auVar102,auVar110);
        auVar100 = vmaxps_avx(auVar100,auVar110);
        auVar221._4_4_ = fVar166;
        auVar221._0_4_ = fVar166;
        auVar221._8_4_ = fVar166;
        auVar221._12_4_ = fVar166;
        auVar221._16_4_ = fVar166;
        auVar221._20_4_ = fVar166;
        auVar221._24_4_ = fVar166;
        auVar221._28_4_ = fVar166;
        uVar77 = vcmpps_avx512vl(auVar100,auVar221,1);
        bVar10 = (bool)((byte)uVar77 & 1);
        auVar115._0_4_ = (float)((uint)bVar10 * auVar104._0_4_ | (uint)!bVar10 * auVar109._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar109._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar109._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar109._12_4_);
        bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * auVar109._16_4_);
        bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * auVar109._20_4_);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * auVar109._24_4_);
        bVar10 = SUB81(uVar77 >> 7,0);
        auVar115._28_4_ = (uint)bVar10 * auVar104._28_4_ | (uint)!bVar10 * auVar109._28_4_;
        bVar10 = (bool)((byte)uVar77 & 1);
        auVar116._0_4_ = (float)((uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * auVar101._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar101._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar101._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar101._12_4_);
        bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar101._16_4_);
        bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar101._20_4_);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar101._24_4_);
        bVar10 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar101._28_4_;
        vandps_avx512vl(auVar113,auVar110);
        vandps_avx512vl(auVar112,auVar110);
        auVar100 = vmaxps_avx(auVar116,auVar116);
        vandps_avx512vl(auVar114,auVar110);
        auVar100 = vmaxps_avx(auVar100,auVar116);
        uVar77 = vcmpps_avx512vl(auVar100,auVar221,1);
        bVar10 = (bool)((byte)uVar77 & 1);
        auVar110._0_4_ = (float)((uint)bVar10 * auVar104._0_4_ | (uint)!bVar10 * auVar113._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar113._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar113._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar113._12_4_);
        bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * auVar113._16_4_);
        bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * auVar113._20_4_);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * auVar113._24_4_);
        bVar10 = SUB81(uVar77 >> 7,0);
        auVar110._28_4_ = (uint)bVar10 * auVar104._28_4_ | (uint)!bVar10 * auVar113._28_4_;
        bVar10 = (bool)((byte)uVar77 & 1);
        auVar117._0_4_ = (float)((uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * auVar112._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar112._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar112._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar112._12_4_);
        bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar112._16_4_);
        bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar112._20_4_);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar112._24_4_);
        bVar10 = SUB81(uVar77 >> 7,0);
        auVar117._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar112._28_4_;
        auVar99 = vxorps_avx512vl(local_680._0_16_,local_680._0_16_);
        auVar100 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar99));
        auVar92 = vfmadd231ps_fma(auVar100,auVar116,auVar116);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar92),auVar112);
        fVar166 = auVar113._0_4_;
        fVar213 = auVar113._4_4_;
        fVar214 = auVar113._8_4_;
        fVar162 = auVar113._12_4_;
        fVar179 = auVar113._16_4_;
        fVar190 = auVar113._20_4_;
        fVar191 = auVar113._24_4_;
        auVar100._4_4_ = fVar213 * fVar213 * fVar213 * auVar101._4_4_;
        auVar100._0_4_ = fVar166 * fVar166 * fVar166 * auVar101._0_4_;
        auVar100._8_4_ = fVar214 * fVar214 * fVar214 * auVar101._8_4_;
        auVar100._12_4_ = fVar162 * fVar162 * fVar162 * auVar101._12_4_;
        auVar100._16_4_ = fVar179 * fVar179 * fVar179 * auVar101._16_4_;
        auVar100._20_4_ = fVar190 * fVar190 * fVar190 * auVar101._20_4_;
        auVar100._24_4_ = fVar191 * fVar191 * fVar191 * auVar101._24_4_;
        auVar100._28_4_ = auVar114._28_4_;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,auVar113);
        auVar114._4_4_ = auVar116._4_4_ * auVar100._4_4_;
        auVar114._0_4_ = auVar116._0_4_ * auVar100._0_4_;
        auVar114._8_4_ = auVar116._8_4_ * auVar100._8_4_;
        auVar114._12_4_ = auVar116._12_4_ * auVar100._12_4_;
        auVar114._16_4_ = auVar116._16_4_ * auVar100._16_4_;
        auVar114._20_4_ = auVar116._20_4_ * auVar100._20_4_;
        auVar114._24_4_ = auVar116._24_4_ * auVar100._24_4_;
        auVar114._28_4_ = auVar101._28_4_;
        auVar113._4_4_ = auVar100._4_4_ * -auVar115._4_4_;
        auVar113._0_4_ = auVar100._0_4_ * -auVar115._0_4_;
        auVar113._8_4_ = auVar100._8_4_ * -auVar115._8_4_;
        auVar113._12_4_ = auVar100._12_4_ * -auVar115._12_4_;
        auVar113._16_4_ = auVar100._16_4_ * -auVar115._16_4_;
        auVar113._20_4_ = auVar100._20_4_ * -auVar115._20_4_;
        auVar113._24_4_ = auVar100._24_4_ * -auVar115._24_4_;
        auVar113._28_4_ = auVar116._28_4_;
        auVar104 = vmulps_avx512vl(auVar100,ZEXT1632(auVar99));
        auVar115 = ZEXT1632(auVar99);
        auVar101 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar115);
        auVar92 = vfmadd231ps_fma(auVar101,auVar117,auVar117);
        auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar92),auVar112);
        fVar166 = auVar105._0_4_;
        fVar213 = auVar105._4_4_;
        fVar214 = auVar105._8_4_;
        fVar162 = auVar105._12_4_;
        fVar179 = auVar105._16_4_;
        fVar190 = auVar105._20_4_;
        fVar191 = auVar105._24_4_;
        auVar112._4_4_ = fVar213 * fVar213 * fVar213 * auVar109._4_4_;
        auVar112._0_4_ = fVar166 * fVar166 * fVar166 * auVar109._0_4_;
        auVar112._8_4_ = fVar214 * fVar214 * fVar214 * auVar109._8_4_;
        auVar112._12_4_ = fVar162 * fVar162 * fVar162 * auVar109._12_4_;
        auVar112._16_4_ = fVar179 * fVar179 * fVar179 * auVar109._16_4_;
        auVar112._20_4_ = fVar190 * fVar190 * fVar190 * auVar109._20_4_;
        auVar112._24_4_ = fVar191 * fVar191 * fVar191 * auVar109._24_4_;
        auVar112._28_4_ = auVar100._28_4_;
        auVar100 = vfmadd231ps_avx512vl(auVar112,auVar102,auVar105);
        auVar101._4_4_ = auVar117._4_4_ * auVar100._4_4_;
        auVar101._0_4_ = auVar117._0_4_ * auVar100._0_4_;
        auVar101._8_4_ = auVar117._8_4_ * auVar100._8_4_;
        auVar101._12_4_ = auVar117._12_4_ * auVar100._12_4_;
        auVar101._16_4_ = auVar117._16_4_ * auVar100._16_4_;
        auVar101._20_4_ = auVar117._20_4_ * auVar100._20_4_;
        auVar101._24_4_ = auVar117._24_4_ * auVar100._24_4_;
        auVar101._28_4_ = auVar109._28_4_;
        auVar102._4_4_ = auVar100._4_4_ * -auVar110._4_4_;
        auVar102._0_4_ = auVar100._0_4_ * -auVar110._0_4_;
        auVar102._8_4_ = auVar100._8_4_ * -auVar110._8_4_;
        auVar102._12_4_ = auVar100._12_4_ * -auVar110._12_4_;
        auVar102._16_4_ = auVar100._16_4_ * -auVar110._16_4_;
        auVar102._20_4_ = auVar100._20_4_ * -auVar110._20_4_;
        auVar102._24_4_ = auVar100._24_4_ * -auVar110._24_4_;
        auVar102._28_4_ = auVar105._28_4_;
        auVar100 = vmulps_avx512vl(auVar100,auVar115);
        auVar92 = vfmadd213ps_fma(auVar114,auVar107,ZEXT1632(auVar29));
        auVar97 = vfmadd213ps_fma(auVar113,auVar107,ZEXT1632(auVar93));
        auVar112 = vfmadd213ps_avx512vl(auVar104,auVar107,auVar103);
        auVar105 = vfmadd213ps_avx512vl(auVar101,auVar108,ZEXT1632(auVar91));
        auVar29 = vfnmadd213ps_fma(auVar114,auVar107,ZEXT1632(auVar29));
        auVar95 = vfmadd213ps_fma(auVar102,auVar108,ZEXT1632(auVar90));
        auVar93 = vfnmadd213ps_fma(auVar113,auVar107,ZEXT1632(auVar93));
        auVar24 = vfmadd213ps_fma(auVar100,auVar108,auVar111);
        auVar96 = vfnmadd231ps_fma(auVar103,auVar107,auVar104);
        auVar91 = vfnmadd213ps_fma(auVar101,auVar108,ZEXT1632(auVar91));
        auVar90 = vfnmadd213ps_fma(auVar102,auVar108,ZEXT1632(auVar90));
        auVar98 = vfnmadd231ps_fma(auVar111,auVar108,auVar100);
        auVar113 = vsubps_avx512vl(auVar105,ZEXT1632(auVar29));
        auVar100 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar93));
        auVar114 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar96));
        auVar111._4_4_ = auVar100._4_4_ * auVar96._4_4_;
        auVar111._0_4_ = auVar100._0_4_ * auVar96._0_4_;
        auVar111._8_4_ = auVar100._8_4_ * auVar96._8_4_;
        auVar111._12_4_ = auVar100._12_4_ * auVar96._12_4_;
        auVar111._16_4_ = auVar100._16_4_ * 0.0;
        auVar111._20_4_ = auVar100._20_4_ * 0.0;
        auVar111._24_4_ = auVar100._24_4_ * 0.0;
        auVar111._28_4_ = auVar104._28_4_;
        auVar26 = vfmsub231ps_fma(auVar111,ZEXT1632(auVar93),auVar114);
        auVar103._4_4_ = auVar114._4_4_ * auVar29._4_4_;
        auVar103._0_4_ = auVar114._0_4_ * auVar29._0_4_;
        auVar103._8_4_ = auVar114._8_4_ * auVar29._8_4_;
        auVar103._12_4_ = auVar114._12_4_ * auVar29._12_4_;
        auVar103._16_4_ = auVar114._16_4_ * 0.0;
        auVar103._20_4_ = auVar114._20_4_ * 0.0;
        auVar103._24_4_ = auVar114._24_4_ * 0.0;
        auVar103._28_4_ = auVar114._28_4_;
        auVar27 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar96),auVar113);
        auVar104._4_4_ = auVar93._4_4_ * auVar113._4_4_;
        auVar104._0_4_ = auVar93._0_4_ * auVar113._0_4_;
        auVar104._8_4_ = auVar93._8_4_ * auVar113._8_4_;
        auVar104._12_4_ = auVar93._12_4_ * auVar113._12_4_;
        auVar104._16_4_ = auVar113._16_4_ * 0.0;
        auVar104._20_4_ = auVar113._20_4_ * 0.0;
        auVar104._24_4_ = auVar113._24_4_ * 0.0;
        auVar104._28_4_ = auVar113._28_4_;
        auVar28 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar29),auVar100);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar115,ZEXT1632(auVar27));
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,ZEXT1632(auVar26));
        auVar110 = ZEXT1632(auVar99);
        uVar77 = vcmpps_avx512vl(auVar100,auVar110,2);
        bVar76 = (byte)uVar77;
        fVar88 = (float)((uint)(bVar76 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar138 = (float)((uint)bVar10 * auVar92._4_4_ | (uint)!bVar10 * auVar91._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar140 = (float)((uint)bVar10 * auVar92._8_4_ | (uint)!bVar10 * auVar91._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar142 = (float)((uint)bVar10 * auVar92._12_4_ | (uint)!bVar10 * auVar91._12_4_);
        auVar111 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar88))));
        fVar89 = (float)((uint)(bVar76 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar90._0_4_);
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar139 = (float)((uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar90._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar141 = (float)((uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar90._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar143 = (float)((uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar90._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar89))));
        auVar118._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar98._0_4_
                    );
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar10 * auVar112._4_4_ | (uint)!bVar10 * auVar98._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar10 * auVar112._8_4_ | (uint)!bVar10 * auVar98._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar10 * auVar112._12_4_ | (uint)!bVar10 * auVar98._12_4_);
        fVar213 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar112._16_4_);
        auVar118._16_4_ = fVar213;
        fVar166 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar112._20_4_);
        auVar118._20_4_ = fVar166;
        fVar214 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar112._24_4_);
        auVar118._24_4_ = fVar214;
        iVar1 = (uint)(byte)(uVar77 >> 7) * auVar112._28_4_;
        auVar118._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar29),auVar105);
        auVar119._0_4_ =
             (uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar92._0_4_;
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar92._4_4_;
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar92._8_4_;
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar92._12_4_;
        auVar119._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_;
        auVar119._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_;
        auVar119._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_;
        auVar119._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar95));
        auVar120._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar26._0_4_
                    );
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar26._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar26._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar26._12_4_);
        fVar162 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
        auVar120._16_4_ = fVar162;
        fVar179 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
        auVar120._20_4_ = fVar179;
        fVar190 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
        auVar120._24_4_ = fVar190;
        auVar120._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar24));
        auVar121._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar97._0_4_
                    );
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar97._4_4_);
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar97._8_4_);
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar97._12_4_);
        fVar191 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
        auVar121._16_4_ = fVar191;
        fVar192 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
        auVar121._20_4_ = fVar192;
        fVar193 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
        auVar121._24_4_ = fVar193;
        iVar2 = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
        auVar121._28_4_ = iVar2;
        auVar122._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar29._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar105._0_4_;
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar10 * (int)auVar29._4_4_ | (uint)!bVar10 * auVar105._4_4_;
        bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar10 * (int)auVar29._8_4_ | (uint)!bVar10 * auVar105._8_4_;
        bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar10 * (int)auVar29._12_4_ | (uint)!bVar10 * auVar105._12_4_;
        auVar122._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar105._16_4_;
        auVar122._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar105._20_4_;
        auVar122._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar105._24_4_;
        auVar122._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar105._28_4_;
        bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar104 = vsubps_avx512vl(auVar122,auVar111);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar93._12_4_ |
                                                 (uint)!bVar14 * auVar95._12_4_,
                                                 CONCAT48((uint)bVar12 * (int)auVar93._8_4_ |
                                                          (uint)!bVar12 * auVar95._8_4_,
                                                          CONCAT44((uint)bVar10 * (int)auVar93._4_4_
                                                                   | (uint)!bVar10 * auVar95._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar95._0_4_)))),auVar103);
        auVar206 = ZEXT3264(auVar114);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar96._12_4_ |
                                                 (uint)!bVar15 * auVar24._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar96._8_4_ |
                                                          (uint)!bVar13 * auVar24._8_4_,
                                                          CONCAT44((uint)bVar11 * (int)auVar96._4_4_
                                                                   | (uint)!bVar11 * auVar24._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar96._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar24._0_4_)))),auVar118);
        auVar112 = vsubps_avx(auVar111,auVar119);
        auVar211 = ZEXT3264(auVar112);
        auVar101 = vsubps_avx(auVar103,auVar120);
        auVar102 = vsubps_avx(auVar118,auVar121);
        auVar105._4_4_ = auVar113._4_4_ * fVar138;
        auVar105._0_4_ = auVar113._0_4_ * fVar88;
        auVar105._8_4_ = auVar113._8_4_ * fVar140;
        auVar105._12_4_ = auVar113._12_4_ * fVar142;
        auVar105._16_4_ = auVar113._16_4_ * 0.0;
        auVar105._20_4_ = auVar113._20_4_ * 0.0;
        auVar105._24_4_ = auVar113._24_4_ * 0.0;
        auVar105._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar105,auVar118,auVar104);
        auVar186._0_4_ = fVar89 * auVar104._0_4_;
        auVar186._4_4_ = fVar139 * auVar104._4_4_;
        auVar186._8_4_ = fVar141 * auVar104._8_4_;
        auVar186._12_4_ = fVar143 * auVar104._12_4_;
        auVar186._16_4_ = auVar104._16_4_ * 0.0;
        auVar186._20_4_ = auVar104._20_4_ * 0.0;
        auVar186._24_4_ = auVar104._24_4_ * 0.0;
        auVar186._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar186,auVar111,auVar114);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar110,ZEXT1632(auVar92));
        auVar196._0_4_ = auVar114._0_4_ * auVar118._0_4_;
        auVar196._4_4_ = auVar114._4_4_ * auVar118._4_4_;
        auVar196._8_4_ = auVar114._8_4_ * auVar118._8_4_;
        auVar196._12_4_ = auVar114._12_4_ * auVar118._12_4_;
        auVar196._16_4_ = auVar114._16_4_ * fVar213;
        auVar196._20_4_ = auVar114._20_4_ * fVar166;
        auVar196._24_4_ = auVar114._24_4_ * fVar214;
        auVar196._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar196,auVar103,auVar113);
        auVar105 = vfmadd231ps_avx512vl(auVar100,auVar110,ZEXT1632(auVar92));
        auVar100 = vmulps_avx512vl(auVar102,auVar119);
        auVar100 = vfmsub231ps_avx512vl(auVar100,auVar112,auVar121);
        auVar109._4_4_ = auVar101._4_4_ * auVar121._4_4_;
        auVar109._0_4_ = auVar101._0_4_ * auVar121._0_4_;
        auVar109._8_4_ = auVar101._8_4_ * auVar121._8_4_;
        auVar109._12_4_ = auVar101._12_4_ * auVar121._12_4_;
        auVar109._16_4_ = auVar101._16_4_ * fVar191;
        auVar109._20_4_ = auVar101._20_4_ * fVar192;
        auVar109._24_4_ = auVar101._24_4_ * fVar193;
        auVar109._28_4_ = iVar2;
        auVar92 = vfmsub231ps_fma(auVar109,auVar120,auVar102);
        auVar197._0_4_ = auVar120._0_4_ * auVar112._0_4_;
        auVar197._4_4_ = auVar120._4_4_ * auVar112._4_4_;
        auVar197._8_4_ = auVar120._8_4_ * auVar112._8_4_;
        auVar197._12_4_ = auVar120._12_4_ * auVar112._12_4_;
        auVar197._16_4_ = fVar162 * auVar112._16_4_;
        auVar197._20_4_ = fVar179 * auVar112._20_4_;
        auVar197._24_4_ = fVar190 * auVar112._24_4_;
        auVar197._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar197,auVar101,auVar119);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar110,auVar100);
        auVar109 = vfmadd231ps_avx512vl(auVar100,auVar110,ZEXT1632(auVar92));
        auVar200 = ZEXT3264(auVar109);
        auVar100 = vmaxps_avx(auVar105,auVar109);
        uVar30 = vcmpps_avx512vl(auVar100,auVar110,2);
        bVar86 = bVar86 & (byte)uVar30;
        if (bVar86 != 0) {
          uVar144 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar224._4_4_ = uVar144;
          auVar224._0_4_ = uVar144;
          auVar224._8_4_ = uVar144;
          auVar224._12_4_ = uVar144;
          auVar224._16_4_ = uVar144;
          auVar224._20_4_ = uVar144;
          auVar224._24_4_ = uVar144;
          auVar224._28_4_ = uVar144;
          auVar227 = ZEXT3264(auVar224);
          auVar38._4_4_ = auVar102._4_4_ * auVar114._4_4_;
          auVar38._0_4_ = auVar102._0_4_ * auVar114._0_4_;
          auVar38._8_4_ = auVar102._8_4_ * auVar114._8_4_;
          auVar38._12_4_ = auVar102._12_4_ * auVar114._12_4_;
          auVar38._16_4_ = auVar102._16_4_ * auVar114._16_4_;
          auVar38._20_4_ = auVar102._20_4_ * auVar114._20_4_;
          auVar38._24_4_ = auVar102._24_4_ * auVar114._24_4_;
          auVar38._28_4_ = auVar100._28_4_;
          auVar24 = vfmsub231ps_fma(auVar38,auVar101,auVar113);
          auVar39._4_4_ = auVar113._4_4_ * auVar112._4_4_;
          auVar39._0_4_ = auVar113._0_4_ * auVar112._0_4_;
          auVar39._8_4_ = auVar113._8_4_ * auVar112._8_4_;
          auVar39._12_4_ = auVar113._12_4_ * auVar112._12_4_;
          auVar39._16_4_ = auVar113._16_4_ * auVar112._16_4_;
          auVar39._20_4_ = auVar113._20_4_ * auVar112._20_4_;
          auVar39._24_4_ = auVar113._24_4_ * auVar112._24_4_;
          auVar39._28_4_ = auVar113._28_4_;
          auVar95 = vfmsub231ps_fma(auVar39,auVar104,auVar102);
          auVar40._4_4_ = auVar101._4_4_ * auVar104._4_4_;
          auVar40._0_4_ = auVar101._0_4_ * auVar104._0_4_;
          auVar40._8_4_ = auVar101._8_4_ * auVar104._8_4_;
          auVar40._12_4_ = auVar101._12_4_ * auVar104._12_4_;
          auVar40._16_4_ = auVar101._16_4_ * auVar104._16_4_;
          auVar40._20_4_ = auVar101._20_4_ * auVar104._20_4_;
          auVar40._24_4_ = auVar101._24_4_ * auVar104._24_4_;
          auVar40._28_4_ = auVar101._28_4_;
          auVar26 = vfmsub231ps_fma(auVar40,auVar112,auVar114);
          auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar26));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar24),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar34._16_4_ = 0x3f800000;
          auVar34._20_4_ = 0x3f800000;
          auVar34._24_4_ = 0x3f800000;
          auVar34._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar97),auVar34);
          auVar92 = vfmadd132ps_fma(auVar114,auVar100,auVar100);
          auVar206 = ZEXT1664(auVar92);
          auVar41._4_4_ = auVar26._4_4_ * auVar118._4_4_;
          auVar41._0_4_ = auVar26._0_4_ * auVar118._0_4_;
          auVar41._8_4_ = auVar26._8_4_ * auVar118._8_4_;
          auVar41._12_4_ = auVar26._12_4_ * auVar118._12_4_;
          auVar41._16_4_ = fVar213 * 0.0;
          auVar41._20_4_ = fVar166 * 0.0;
          auVar41._24_4_ = fVar214 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar41,auVar103,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar111,ZEXT1632(auVar24));
          fVar166 = auVar92._0_4_;
          fVar213 = auVar92._4_4_;
          fVar214 = auVar92._8_4_;
          fVar162 = auVar92._12_4_;
          local_5e0._28_4_ = auVar100._28_4_;
          local_5e0._0_28_ =
               ZEXT1628(CONCAT412(auVar95._12_4_ * fVar162,
                                  CONCAT48(auVar95._8_4_ * fVar214,
                                           CONCAT44(auVar95._4_4_ * fVar213,auVar95._0_4_ * fVar166)
                                          )));
          auVar211 = ZEXT3264(local_5e0);
          auVar150._4_4_ = local_7a0;
          auVar150._0_4_ = local_7a0;
          auVar150._8_4_ = local_7a0;
          auVar150._12_4_ = local_7a0;
          auVar150._16_4_ = local_7a0;
          auVar150._20_4_ = local_7a0;
          auVar150._24_4_ = local_7a0;
          auVar150._28_4_ = local_7a0;
          uVar30 = vcmpps_avx512vl(local_5e0,auVar224,2);
          uVar31 = vcmpps_avx512vl(auVar150,local_5e0,2);
          bVar86 = (byte)uVar30 & (byte)uVar31 & bVar86;
          if (bVar86 != 0) {
            uVar87 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar87 = bVar86 & uVar87;
            if ((char)uVar87 != '\0') {
              fVar179 = auVar105._0_4_ * fVar166;
              fVar190 = auVar105._4_4_ * fVar213;
              auVar42._4_4_ = fVar190;
              auVar42._0_4_ = fVar179;
              fVar191 = auVar105._8_4_ * fVar214;
              auVar42._8_4_ = fVar191;
              fVar192 = auVar105._12_4_ * fVar162;
              auVar42._12_4_ = fVar192;
              fVar193 = auVar105._16_4_ * 0.0;
              auVar42._16_4_ = fVar193;
              fVar88 = auVar105._20_4_ * 0.0;
              auVar42._20_4_ = fVar88;
              fVar89 = auVar105._24_4_ * 0.0;
              auVar42._24_4_ = fVar89;
              auVar42._28_4_ = auVar105._28_4_;
              auVar151._8_4_ = 0x3f800000;
              auVar151._0_8_ = 0x3f8000003f800000;
              auVar151._12_4_ = 0x3f800000;
              auVar151._16_4_ = 0x3f800000;
              auVar151._20_4_ = 0x3f800000;
              auVar151._24_4_ = 0x3f800000;
              auVar151._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar151,auVar42);
              local_620._0_4_ =
                   (float)((uint)(bVar76 & 1) * (int)fVar179 |
                          (uint)!(bool)(bVar76 & 1) * auVar100._0_4_);
              bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
              local_620._4_4_ =
                   (float)((uint)bVar10 * (int)fVar190 | (uint)!bVar10 * auVar100._4_4_);
              bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
              local_620._8_4_ =
                   (float)((uint)bVar10 * (int)fVar191 | (uint)!bVar10 * auVar100._8_4_);
              bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
              local_620._12_4_ =
                   (float)((uint)bVar10 * (int)fVar192 | (uint)!bVar10 * auVar100._12_4_);
              bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
              local_620._16_4_ =
                   (float)((uint)bVar10 * (int)fVar193 | (uint)!bVar10 * auVar100._16_4_);
              bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
              local_620._20_4_ =
                   (float)((uint)bVar10 * (int)fVar88 | (uint)!bVar10 * auVar100._20_4_);
              bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
              local_620._24_4_ =
                   (float)((uint)bVar10 * (int)fVar89 | (uint)!bVar10 * auVar100._24_4_);
              bVar10 = SUB81(uVar77 >> 7,0);
              local_620._28_4_ =
                   (float)((uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar100._28_4_);
              auVar100 = vsubps_avx(auVar108,auVar107);
              auVar92 = vfmadd213ps_fma(auVar100,local_620,auVar107);
              uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar107._4_4_ = uVar144;
              auVar107._0_4_ = uVar144;
              auVar107._8_4_ = uVar144;
              auVar107._12_4_ = uVar144;
              auVar107._16_4_ = uVar144;
              auVar107._20_4_ = uVar144;
              auVar107._24_4_ = uVar144;
              auVar107._28_4_ = uVar144;
              auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                            CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                     CONCAT44(auVar92._4_4_ +
                                                                              auVar92._4_4_,
                                                                              auVar92._0_4_ +
                                                                              auVar92._0_4_)))),
                                         auVar107);
              uVar32 = vcmpps_avx512vl(local_5e0,auVar100,6);
              uVar87 = uVar87 & uVar32;
              bVar86 = (byte)uVar87;
              if (bVar86 != 0) {
                auVar177._0_4_ = auVar109._0_4_ * fVar166;
                auVar177._4_4_ = auVar109._4_4_ * fVar213;
                auVar177._8_4_ = auVar109._8_4_ * fVar214;
                auVar177._12_4_ = auVar109._12_4_ * fVar162;
                auVar177._16_4_ = auVar109._16_4_ * 0.0;
                auVar177._20_4_ = auVar109._20_4_ * 0.0;
                auVar177._24_4_ = auVar109._24_4_ * 0.0;
                auVar177._28_4_ = 0;
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = 0x3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                auVar187._16_4_ = 0x3f800000;
                auVar187._20_4_ = 0x3f800000;
                auVar187._24_4_ = 0x3f800000;
                auVar187._28_4_ = 0x3f800000;
                auVar100 = vsubps_avx(auVar187,auVar177);
                auVar123._0_4_ =
                     (uint)(bVar76 & 1) * (int)auVar177._0_4_ |
                     (uint)!(bool)(bVar76 & 1) * auVar100._0_4_;
                bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar123._4_4_ = (uint)bVar10 * (int)auVar177._4_4_ | (uint)!bVar10 * auVar100._4_4_
                ;
                bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar123._8_4_ = (uint)bVar10 * (int)auVar177._8_4_ | (uint)!bVar10 * auVar100._8_4_
                ;
                bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar123._12_4_ =
                     (uint)bVar10 * (int)auVar177._12_4_ | (uint)!bVar10 * auVar100._12_4_;
                bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar123._16_4_ =
                     (uint)bVar10 * (int)auVar177._16_4_ | (uint)!bVar10 * auVar100._16_4_;
                bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar123._20_4_ =
                     (uint)bVar10 * (int)auVar177._20_4_ | (uint)!bVar10 * auVar100._20_4_;
                bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar123._24_4_ =
                     (uint)bVar10 * (int)auVar177._24_4_ | (uint)!bVar10 * auVar100._24_4_;
                auVar123._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar100._28_4_;
                auVar108._8_4_ = 0x40000000;
                auVar108._0_8_ = 0x4000000040000000;
                auVar108._12_4_ = 0x40000000;
                auVar108._16_4_ = 0x40000000;
                auVar108._20_4_ = 0x40000000;
                auVar108._24_4_ = 0x40000000;
                auVar108._28_4_ = 0x40000000;
                local_600 = vfmsub132ps_avx512vl(auVar123,auVar187,auVar108);
                local_5c0 = 0;
                local_5b0 = local_880;
                uStack_5a8 = uStack_878;
                local_5a0 = local_870;
                uStack_598 = uStack_868;
                local_590 = local_8a0;
                uStack_588 = uStack_898;
                local_580 = local_890;
                uStack_578 = uStack_888;
                if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar166 = 1.0 / auVar106._0_4_;
                  local_560[0] = fVar166 * (local_620._0_4_ + 0.0);
                  local_560[1] = fVar166 * (local_620._4_4_ + 1.0);
                  local_560[2] = fVar166 * (local_620._8_4_ + 2.0);
                  local_560[3] = fVar166 * (local_620._12_4_ + 3.0);
                  fStack_550 = fVar166 * (local_620._16_4_ + 4.0);
                  fStack_54c = fVar166 * (local_620._20_4_ + 5.0);
                  fStack_548 = fVar166 * (local_620._24_4_ + 6.0);
                  fStack_544 = local_620._28_4_ + 7.0;
                  local_540 = local_600;
                  local_520 = local_5e0;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar100 = vblendmps_avx512vl(auVar152,local_5e0);
                  auVar124._0_4_ =
                       (uint)(bVar86 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar124._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar124._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar124._12_4_ = (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 4) & 1);
                  auVar124._16_4_ = (uint)bVar10 * auVar100._16_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
                  auVar124._20_4_ = (uint)bVar10 * auVar100._20_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar87 >> 6) & 1);
                  auVar124._24_4_ = (uint)bVar10 * auVar100._24_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = SUB81(uVar87 >> 7,0);
                  auVar124._28_4_ = (uint)bVar10 * auVar100._28_4_ | (uint)!bVar10 * 0x7f800000;
                  auVar100 = vshufps_avx(auVar124,auVar124,0xb1);
                  auVar100 = vminps_avx(auVar124,auVar100);
                  auVar114 = vshufpd_avx(auVar100,auVar100,5);
                  auVar100 = vminps_avx(auVar100,auVar114);
                  auVar114 = vpermpd_avx2(auVar100,0x4e);
                  auVar100 = vminps_avx(auVar100,auVar114);
                  uVar30 = vcmpps_avx512vl(auVar124,auVar100,0);
                  uVar79 = (uint)uVar87;
                  if (((byte)uVar30 & bVar86) != 0) {
                    uVar79 = (uint)((byte)uVar30 & bVar86);
                  }
                  uVar80 = 0;
                  for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                    uVar80 = uVar80 + 1;
                  }
                  uVar77 = (ulong)uVar80;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar200 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar200);
                    auVar200 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar200);
                    local_820 = local_5e0;
                    local_5bc = iVar7;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_560[uVar77]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_540 + uVar77 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_520 + uVar77 * 4)
                      ;
                      local_858.context = context->user;
                      fVar162 = local_200._0_4_;
                      fVar213 = 1.0 - fVar162;
                      fVar166 = fVar213 * fVar213 * -3.0;
                      auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                                ZEXT416((uint)(fVar162 * fVar213)),
                                                ZEXT416(0xc0000000));
                      auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar162 * fVar213)),
                                                ZEXT416((uint)(fVar162 * fVar162)),
                                                ZEXT416(0x40000000));
                      fVar213 = auVar92._0_4_ * 3.0;
                      fVar214 = auVar97._0_4_ * 3.0;
                      fVar162 = fVar162 * fVar162 * 3.0;
                      auVar205._0_4_ = fVar162 * fVar159;
                      auVar205._4_4_ = fVar162 * fVar160;
                      auVar205._8_4_ = fVar162 * fVar161;
                      auVar205._12_4_ = fVar162 * fVar75;
                      auVar148._4_4_ = fVar214;
                      auVar148._0_4_ = fVar214;
                      auVar148._8_4_ = fVar214;
                      auVar148._12_4_ = fVar214;
                      auVar92 = vfmadd132ps_fma(auVar148,auVar205,auVar25);
                      auVar185._4_4_ = fVar213;
                      auVar185._0_4_ = fVar213;
                      auVar185._8_4_ = fVar213;
                      auVar185._12_4_ = fVar213;
                      auVar92 = vfmadd132ps_fma(auVar185,auVar92,auVar145);
                      auVar149._4_4_ = fVar166;
                      auVar149._0_4_ = fVar166;
                      auVar149._8_4_ = fVar166;
                      auVar149._12_4_ = fVar166;
                      auVar92 = vfmadd132ps_fma(auVar149,auVar92,auVar94);
                      auVar230 = vbroadcastss_avx512f(auVar92);
                      auVar200 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar200 = vpermps_avx512f(auVar200,ZEXT1664(auVar92));
                      auVar206 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar206,ZEXT1664(auVar92));
                      local_2c0[0] = (RTCHitN)auVar230[0];
                      local_2c0[1] = (RTCHitN)auVar230[1];
                      local_2c0[2] = (RTCHitN)auVar230[2];
                      local_2c0[3] = (RTCHitN)auVar230[3];
                      local_2c0[4] = (RTCHitN)auVar230[4];
                      local_2c0[5] = (RTCHitN)auVar230[5];
                      local_2c0[6] = (RTCHitN)auVar230[6];
                      local_2c0[7] = (RTCHitN)auVar230[7];
                      local_2c0[8] = (RTCHitN)auVar230[8];
                      local_2c0[9] = (RTCHitN)auVar230[9];
                      local_2c0[10] = (RTCHitN)auVar230[10];
                      local_2c0[0xb] = (RTCHitN)auVar230[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar230[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar230[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar230[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar230[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar230[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar230[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar230[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar230[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar230[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar230[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar230[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar230[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar230[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar230[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar230[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar230[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar230[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar230[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar230[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar230[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar230[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar230[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar230[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar230[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar230[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar230[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar230[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar230[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar230[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar230[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar230[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar230[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar230[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar230[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar230[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar230[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar230[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar230[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar230[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar230[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar230[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar230[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar230[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar230[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar230[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar230[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar230[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar230[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar230[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar230[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar230[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar230[0x3f];
                      local_280 = auVar200;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar230 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar230);
                      auVar100 = vpcmpeqd_avx2(auVar230._0_32_,auVar230._0_32_);
                      local_828[3] = auVar100;
                      local_828[2] = auVar100;
                      local_828[1] = auVar100;
                      *local_828 = auVar100;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instPrimID[0]));
                      auVar230 = vmovdqa64_avx512f(local_300);
                      local_780 = vmovdqa64_avx512f(auVar230);
                      local_858.valid = (int *)local_780;
                      local_858.geometryUserPtr = pGVar83->userPtr;
                      local_858.hit = local_2c0;
                      local_858.N = 0x10;
                      local_7c0 = auVar227._0_32_;
                      local_858.ray = (RTCRayN *)ray;
                      if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (*pGVar83->intersectionFilterN)(&local_858);
                        auVar211 = ZEXT3264(local_820);
                        auVar227 = ZEXT3264(local_7c0);
                        auVar228 = ZEXT3264(local_7e0);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar229 = ZEXT3264(auVar100);
                        auVar100 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar158 = ZEXT3264(auVar100);
                        auVar230 = vmovdqa64_avx512f(local_780);
                      }
                      uVar30 = vptestmd_avx512f(auVar230,auVar230);
                      if ((short)uVar30 == 0) {
LAB_01aa4b40:
                        *(int *)(ray + k * 4 + 0x200) = auVar227._0_4_;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*p_Var9)(&local_858);
                          auVar211 = ZEXT3264(local_820);
                          auVar227 = ZEXT3264(local_7c0);
                          auVar228 = ZEXT3264(local_7e0);
                          auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar229 = ZEXT3264(auVar100);
                          auVar100 = vbroadcastss_avx512vl(ZEXT416(1));
                          auVar158 = ZEXT3264(auVar100);
                          auVar230 = vmovdqa64_avx512f(local_780);
                        }
                        uVar32 = vptestmd_avx512f(auVar230,auVar230);
                        if ((short)uVar32 == 0) goto LAB_01aa4b40;
                        iVar1 = *(int *)(local_858.hit + 4);
                        iVar2 = *(int *)(local_858.hit + 8);
                        iVar61 = *(int *)(local_858.hit + 0xc);
                        iVar62 = *(int *)(local_858.hit + 0x10);
                        iVar63 = *(int *)(local_858.hit + 0x14);
                        iVar64 = *(int *)(local_858.hit + 0x18);
                        iVar65 = *(int *)(local_858.hit + 0x1c);
                        iVar66 = *(int *)(local_858.hit + 0x20);
                        iVar67 = *(int *)(local_858.hit + 0x24);
                        iVar68 = *(int *)(local_858.hit + 0x28);
                        iVar69 = *(int *)(local_858.hit + 0x2c);
                        iVar70 = *(int *)(local_858.hit + 0x30);
                        iVar71 = *(int *)(local_858.hit + 0x34);
                        iVar72 = *(int *)(local_858.hit + 0x38);
                        iVar73 = *(int *)(local_858.hit + 0x3c);
                        bVar86 = (byte)uVar32;
                        bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                        bVar76 = (byte)(uVar32 >> 8);
                        bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                        bVar23 = SUB81(uVar32 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x300) =
                             (uint)(bVar86 & 1) * *(int *)local_858.hit |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x300);
                        *(uint *)(local_858.ray + 0x304) =
                             (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 0x304);
                        *(uint *)(local_858.ray + 0x308) =
                             (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_858.ray + 0x308);
                        *(uint *)(local_858.ray + 0x30c) =
                             (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_858.ray + 0x30c)
                        ;
                        *(uint *)(local_858.ray + 0x310) =
                             (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_858.ray + 0x310)
                        ;
                        *(uint *)(local_858.ray + 0x314) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_858.ray + 0x314)
                        ;
                        *(uint *)(local_858.ray + 0x318) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_858.ray + 0x318)
                        ;
                        *(uint *)(local_858.ray + 0x31c) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_858.ray + 0x31c)
                        ;
                        *(uint *)(local_858.ray + 800) =
                             (uint)(bVar76 & 1) * iVar66 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 800);
                        *(uint *)(local_858.ray + 0x324) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_858.ray + 0x324)
                        ;
                        *(uint *)(local_858.ray + 0x328) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_858.ray + 0x328)
                        ;
                        *(uint *)(local_858.ray + 0x32c) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_858.ray + 0x32c)
                        ;
                        *(uint *)(local_858.ray + 0x330) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_858.ray + 0x330)
                        ;
                        *(uint *)(local_858.ray + 0x334) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_858.ray + 0x334)
                        ;
                        *(uint *)(local_858.ray + 0x338) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_858.ray + 0x338)
                        ;
                        *(uint *)(local_858.ray + 0x33c) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_858.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x44);
                        iVar2 = *(int *)(local_858.hit + 0x48);
                        iVar61 = *(int *)(local_858.hit + 0x4c);
                        iVar62 = *(int *)(local_858.hit + 0x50);
                        iVar63 = *(int *)(local_858.hit + 0x54);
                        iVar64 = *(int *)(local_858.hit + 0x58);
                        iVar65 = *(int *)(local_858.hit + 0x5c);
                        iVar66 = *(int *)(local_858.hit + 0x60);
                        iVar67 = *(int *)(local_858.hit + 100);
                        iVar68 = *(int *)(local_858.hit + 0x68);
                        iVar69 = *(int *)(local_858.hit + 0x6c);
                        iVar70 = *(int *)(local_858.hit + 0x70);
                        iVar71 = *(int *)(local_858.hit + 0x74);
                        iVar72 = *(int *)(local_858.hit + 0x78);
                        iVar73 = *(int *)(local_858.hit + 0x7c);
                        bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                        bVar23 = SUB81(uVar32 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x340) =
                             (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x40) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x340);
                        *(uint *)(local_858.ray + 0x344) =
                             (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 0x344);
                        *(uint *)(local_858.ray + 0x348) =
                             (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_858.ray + 0x348);
                        *(uint *)(local_858.ray + 0x34c) =
                             (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_858.ray + 0x34c)
                        ;
                        *(uint *)(local_858.ray + 0x350) =
                             (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_858.ray + 0x350)
                        ;
                        *(uint *)(local_858.ray + 0x354) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_858.ray + 0x354)
                        ;
                        *(uint *)(local_858.ray + 0x358) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_858.ray + 0x358)
                        ;
                        *(uint *)(local_858.ray + 0x35c) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_858.ray + 0x35c)
                        ;
                        *(uint *)(local_858.ray + 0x360) =
                             (uint)(bVar76 & 1) * iVar66 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x360);
                        *(uint *)(local_858.ray + 0x364) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_858.ray + 0x364)
                        ;
                        *(uint *)(local_858.ray + 0x368) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_858.ray + 0x368)
                        ;
                        *(uint *)(local_858.ray + 0x36c) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_858.ray + 0x36c)
                        ;
                        *(uint *)(local_858.ray + 0x370) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_858.ray + 0x370)
                        ;
                        *(uint *)(local_858.ray + 0x374) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_858.ray + 0x374)
                        ;
                        *(uint *)(local_858.ray + 0x378) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_858.ray + 0x378)
                        ;
                        *(uint *)(local_858.ray + 0x37c) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_858.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x84);
                        iVar2 = *(int *)(local_858.hit + 0x88);
                        iVar61 = *(int *)(local_858.hit + 0x8c);
                        iVar62 = *(int *)(local_858.hit + 0x90);
                        iVar63 = *(int *)(local_858.hit + 0x94);
                        iVar64 = *(int *)(local_858.hit + 0x98);
                        iVar65 = *(int *)(local_858.hit + 0x9c);
                        iVar66 = *(int *)(local_858.hit + 0xa0);
                        iVar67 = *(int *)(local_858.hit + 0xa4);
                        iVar68 = *(int *)(local_858.hit + 0xa8);
                        iVar69 = *(int *)(local_858.hit + 0xac);
                        iVar70 = *(int *)(local_858.hit + 0xb0);
                        iVar71 = *(int *)(local_858.hit + 0xb4);
                        iVar72 = *(int *)(local_858.hit + 0xb8);
                        iVar73 = *(int *)(local_858.hit + 0xbc);
                        bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                        bVar23 = SUB81(uVar32 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x380) =
                             (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x80) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x380);
                        *(uint *)(local_858.ray + 900) =
                             (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 900);
                        *(uint *)(local_858.ray + 0x388) =
                             (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_858.ray + 0x388);
                        *(uint *)(local_858.ray + 0x38c) =
                             (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_858.ray + 0x38c)
                        ;
                        *(uint *)(local_858.ray + 0x390) =
                             (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_858.ray + 0x390)
                        ;
                        *(uint *)(local_858.ray + 0x394) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_858.ray + 0x394)
                        ;
                        *(uint *)(local_858.ray + 0x398) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_858.ray + 0x398)
                        ;
                        *(uint *)(local_858.ray + 0x39c) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_858.ray + 0x39c)
                        ;
                        *(uint *)(local_858.ray + 0x3a0) =
                             (uint)(bVar76 & 1) * iVar66 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x3a0);
                        *(uint *)(local_858.ray + 0x3a4) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_858.ray + 0x3a4)
                        ;
                        *(uint *)(local_858.ray + 0x3a8) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_858.ray + 0x3a8)
                        ;
                        *(uint *)(local_858.ray + 0x3ac) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_858.ray + 0x3ac)
                        ;
                        *(uint *)(local_858.ray + 0x3b0) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_858.ray + 0x3b0)
                        ;
                        *(uint *)(local_858.ray + 0x3b4) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_858.ray + 0x3b4)
                        ;
                        *(uint *)(local_858.ray + 0x3b8) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_858.ray + 0x3b8)
                        ;
                        *(uint *)(local_858.ray + 0x3bc) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_858.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0xc4);
                        iVar2 = *(int *)(local_858.hit + 200);
                        iVar61 = *(int *)(local_858.hit + 0xcc);
                        iVar62 = *(int *)(local_858.hit + 0xd0);
                        iVar63 = *(int *)(local_858.hit + 0xd4);
                        iVar64 = *(int *)(local_858.hit + 0xd8);
                        iVar65 = *(int *)(local_858.hit + 0xdc);
                        iVar66 = *(int *)(local_858.hit + 0xe0);
                        iVar67 = *(int *)(local_858.hit + 0xe4);
                        iVar68 = *(int *)(local_858.hit + 0xe8);
                        iVar69 = *(int *)(local_858.hit + 0xec);
                        iVar70 = *(int *)(local_858.hit + 0xf0);
                        iVar71 = *(int *)(local_858.hit + 0xf4);
                        iVar72 = *(int *)(local_858.hit + 0xf8);
                        iVar73 = *(int *)(local_858.hit + 0xfc);
                        bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                        bVar23 = SUB81(uVar32 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x3c0) =
                             (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0xc0) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x3c0);
                        *(uint *)(local_858.ray + 0x3c4) =
                             (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 0x3c4);
                        *(uint *)(local_858.ray + 0x3c8) =
                             (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_858.ray + 0x3c8);
                        *(uint *)(local_858.ray + 0x3cc) =
                             (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_858.ray + 0x3cc)
                        ;
                        *(uint *)(local_858.ray + 0x3d0) =
                             (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_858.ray + 0x3d0)
                        ;
                        *(uint *)(local_858.ray + 0x3d4) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_858.ray + 0x3d4)
                        ;
                        *(uint *)(local_858.ray + 0x3d8) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_858.ray + 0x3d8)
                        ;
                        *(uint *)(local_858.ray + 0x3dc) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_858.ray + 0x3dc)
                        ;
                        *(uint *)(local_858.ray + 0x3e0) =
                             (uint)(bVar76 & 1) * iVar66 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x3e0);
                        *(uint *)(local_858.ray + 0x3e4) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_858.ray + 0x3e4)
                        ;
                        *(uint *)(local_858.ray + 1000) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_858.ray + 1000);
                        *(uint *)(local_858.ray + 0x3ec) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_858.ray + 0x3ec)
                        ;
                        *(uint *)(local_858.ray + 0x3f0) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_858.ray + 0x3f0)
                        ;
                        *(uint *)(local_858.ray + 0x3f4) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_858.ray + 0x3f4)
                        ;
                        *(uint *)(local_858.ray + 0x3f8) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_858.ray + 0x3f8)
                        ;
                        *(uint *)(local_858.ray + 0x3fc) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_858.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x104);
                        iVar2 = *(int *)(local_858.hit + 0x108);
                        iVar61 = *(int *)(local_858.hit + 0x10c);
                        iVar62 = *(int *)(local_858.hit + 0x110);
                        iVar63 = *(int *)(local_858.hit + 0x114);
                        iVar64 = *(int *)(local_858.hit + 0x118);
                        iVar65 = *(int *)(local_858.hit + 0x11c);
                        iVar66 = *(int *)(local_858.hit + 0x120);
                        iVar67 = *(int *)(local_858.hit + 0x124);
                        iVar68 = *(int *)(local_858.hit + 0x128);
                        iVar69 = *(int *)(local_858.hit + 300);
                        iVar70 = *(int *)(local_858.hit + 0x130);
                        iVar71 = *(int *)(local_858.hit + 0x134);
                        iVar72 = *(int *)(local_858.hit + 0x138);
                        iVar73 = *(int *)(local_858.hit + 0x13c);
                        bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                        bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                        bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                        bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                        bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                        bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                        bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                        bVar23 = SUB81(uVar32 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x400) =
                             (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x100) |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x400);
                        *(uint *)(local_858.ray + 0x404) =
                             (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 0x404);
                        *(uint *)(local_858.ray + 0x408) =
                             (uint)bVar11 * iVar2 | (uint)!bVar11 * *(int *)(local_858.ray + 0x408);
                        *(uint *)(local_858.ray + 0x40c) =
                             (uint)bVar12 * iVar61 | (uint)!bVar12 * *(int *)(local_858.ray + 0x40c)
                        ;
                        *(uint *)(local_858.ray + 0x410) =
                             (uint)bVar13 * iVar62 | (uint)!bVar13 * *(int *)(local_858.ray + 0x410)
                        ;
                        *(uint *)(local_858.ray + 0x414) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_858.ray + 0x414)
                        ;
                        *(uint *)(local_858.ray + 0x418) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_858.ray + 0x418)
                        ;
                        *(uint *)(local_858.ray + 0x41c) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_858.ray + 0x41c)
                        ;
                        *(uint *)(local_858.ray + 0x420) =
                             (uint)(bVar76 & 1) * iVar66 |
                             (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x420);
                        *(uint *)(local_858.ray + 0x424) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_858.ray + 0x424)
                        ;
                        *(uint *)(local_858.ray + 0x428) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_858.ray + 0x428)
                        ;
                        *(uint *)(local_858.ray + 0x42c) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_858.ray + 0x42c)
                        ;
                        *(uint *)(local_858.ray + 0x430) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_858.ray + 0x430)
                        ;
                        *(uint *)(local_858.ray + 0x434) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_858.ray + 0x434)
                        ;
                        *(uint *)(local_858.ray + 0x438) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_858.ray + 0x438)
                        ;
                        *(uint *)(local_858.ray + 0x43c) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_858.ray + 0x43c)
                        ;
                        auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x140));
                        auVar227 = vmovdqu32_avx512f(auVar227);
                        *(undefined1 (*) [64])(local_858.ray + 0x440) = auVar227;
                        auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x180));
                        auVar227 = vmovdqu32_avx512f(auVar227);
                        *(undefined1 (*) [64])(local_858.ray + 0x480) = auVar227;
                        auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x1c0));
                        auVar227 = vmovdqa32_avx512f(auVar227);
                        *(undefined1 (*) [64])(local_858.ray + 0x4c0) = auVar227;
                        auVar227 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x200));
                        auVar227 = vmovdqa32_avx512f(auVar227);
                        *(undefined1 (*) [64])(local_858.ray + 0x500) = auVar227;
                        auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar87;
                      uVar144 = auVar227._0_4_;
                      auVar156._4_4_ = uVar144;
                      auVar156._0_4_ = uVar144;
                      auVar156._8_4_ = uVar144;
                      auVar156._12_4_ = uVar144;
                      auVar156._16_4_ = uVar144;
                      auVar156._20_4_ = uVar144;
                      auVar156._24_4_ = uVar144;
                      auVar156._28_4_ = uVar144;
                      uVar30 = vcmpps_avx512vl(auVar211._0_32_,auVar156,2);
                      if ((bVar86 & (byte)uVar30) == 0) goto LAB_01aa3a6a;
                      bVar86 = bVar86 & (byte)uVar30;
                      uVar87 = (ulong)bVar86;
                      auVar157._8_4_ = 0x7f800000;
                      auVar157._0_8_ = 0x7f8000007f800000;
                      auVar157._12_4_ = 0x7f800000;
                      auVar157._16_4_ = 0x7f800000;
                      auVar157._20_4_ = 0x7f800000;
                      auVar157._24_4_ = 0x7f800000;
                      auVar157._28_4_ = 0x7f800000;
                      auVar100 = vblendmps_avx512vl(auVar157,auVar211._0_32_);
                      auVar137._0_4_ =
                           (uint)(bVar86 & 1) * auVar100._0_4_ |
                           (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 1 & 1);
                      auVar137._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 2 & 1);
                      auVar137._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 3 & 1);
                      auVar137._12_4_ = (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 4 & 1);
                      auVar137._16_4_ = (uint)bVar10 * auVar100._16_4_ | (uint)!bVar10 * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 5 & 1);
                      auVar137._20_4_ = (uint)bVar10 * auVar100._20_4_ | (uint)!bVar10 * 0x7f800000;
                      bVar10 = (bool)(bVar86 >> 6 & 1);
                      auVar137._24_4_ = (uint)bVar10 * auVar100._24_4_ | (uint)!bVar10 * 0x7f800000;
                      auVar137._28_4_ =
                           (uint)(bVar86 >> 7) * auVar100._28_4_ |
                           (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                      auVar100 = vshufps_avx(auVar137,auVar137,0xb1);
                      auVar100 = vminps_avx(auVar137,auVar100);
                      auVar114 = vshufpd_avx(auVar100,auVar100,5);
                      auVar100 = vminps_avx(auVar100,auVar114);
                      auVar114 = vpermpd_avx2(auVar100,0x4e);
                      auVar100 = vminps_avx(auVar100,auVar114);
                      uVar30 = vcmpps_avx512vl(auVar137,auVar100,0);
                      bVar76 = (byte)uVar30 & bVar86;
                      if (bVar76 != 0) {
                        bVar86 = bVar76;
                      }
                      uVar79 = 0;
                      for (uVar80 = (uint)bVar86; (uVar80 & 1) == 0;
                          uVar80 = uVar80 >> 1 | 0x80000000) {
                        uVar79 = uVar79 + 1;
                      }
                      uVar77 = (ulong)uVar79;
                    } while( true );
                  }
                  fVar166 = local_560[uVar77];
                  uVar144 = *(undefined4 *)(local_540 + uVar77 * 4);
                  fVar214 = 1.0 - fVar166;
                  fVar213 = fVar214 * fVar214 * -3.0;
                  auVar200 = ZEXT464((uint)fVar213);
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214)),
                                            ZEXT416((uint)(fVar166 * fVar214)),ZEXT416(0xc0000000));
                  auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar166 * fVar214)),
                                            ZEXT416((uint)(fVar166 * fVar166)),ZEXT416(0x40000000));
                  fVar214 = auVar92._0_4_ * 3.0;
                  fVar162 = auVar97._0_4_ * 3.0;
                  fVar179 = fVar166 * fVar166 * 3.0;
                  auVar202._0_4_ = fVar179 * fVar159;
                  auVar202._4_4_ = fVar179 * fVar160;
                  auVar202._8_4_ = fVar179 * fVar161;
                  auVar202._12_4_ = fVar179 * fVar75;
                  auVar206 = ZEXT1664(auVar202);
                  auVar173._4_4_ = fVar162;
                  auVar173._0_4_ = fVar162;
                  auVar173._8_4_ = fVar162;
                  auVar173._12_4_ = fVar162;
                  auVar92 = vfmadd132ps_fma(auVar173,auVar202,auVar25);
                  auVar182._4_4_ = fVar214;
                  auVar182._0_4_ = fVar214;
                  auVar182._8_4_ = fVar214;
                  auVar182._12_4_ = fVar214;
                  auVar92 = vfmadd132ps_fma(auVar182,auVar92,auVar145);
                  auVar174._4_4_ = fVar213;
                  auVar174._0_4_ = fVar213;
                  auVar174._8_4_ = fVar213;
                  auVar174._12_4_ = fVar213;
                  auVar92 = vfmadd132ps_fma(auVar174,auVar92,auVar94);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_520 + uVar77 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar92._0_4_;
                  uVar8 = vextractps_avx(auVar92,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                  uVar8 = vextractps_avx(auVar92,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar166;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar144;
                  *(uint *)(ray + k * 4 + 0x440) = uVar6;
                  *(uint *)(ray + k * 4 + 0x480) = uVar84;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01aa3a6a:
      if (8 < iVar7) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar230 = ZEXT3264(auVar100);
        local_7c0._4_4_ = local_800._0_4_;
        local_7c0._0_4_ = local_800._0_4_;
        local_7c0._8_4_ = local_800._0_4_;
        local_7c0._12_4_ = local_800._0_4_;
        local_7c0._16_4_ = local_800._0_4_;
        local_7c0._20_4_ = local_800._0_4_;
        local_7c0._24_4_ = local_800._0_4_;
        local_7c0._28_4_ = local_800._0_4_;
        uStack_79c = local_7a0;
        uStack_798 = local_7a0;
        uStack_794 = local_7a0;
        uStack_790 = local_7a0;
        uStack_78c = local_7a0;
        uStack_788 = local_7a0;
        uStack_784 = local_7a0;
        local_3a0 = 1.0 / (float)local_440._0_4_;
        fStack_39c = local_3a0;
        fStack_398 = local_3a0;
        fStack_394 = local_3a0;
        fStack_390 = local_3a0;
        fStack_38c = local_3a0;
        fStack_388 = local_3a0;
        fStack_384 = local_3a0;
        auVar227 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar227);
        auVar227 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar227);
        lVar82 = 8;
LAB_01aa3b19:
        auVar100 = vpbroadcastd_avx512vl();
        auVar100 = vpor_avx2(auVar100,_DAT_01fe9900);
        uVar31 = vpcmpgtd_avx512vl(auVar230._0_32_,auVar100);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 * 4 + lVar60);
        auVar114 = *(undefined1 (*) [32])(lVar60 + 0x21aa768 + lVar82 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar60 + 0x21aabec + lVar82 * 4);
        auVar112 = *(undefined1 (*) [32])(lVar60 + 0x21ab070 + lVar82 * 4);
        auVar227._0_4_ = auVar112._0_4_ * (float)local_700._0_4_;
        auVar227._4_4_ = auVar112._4_4_ * (float)local_700._4_4_;
        auVar227._8_4_ = auVar112._8_4_ * fStack_6f8;
        auVar227._12_4_ = auVar112._12_4_ * fStack_6f4;
        auVar227._16_4_ = auVar112._16_4_ * fStack_6f0;
        auVar227._20_4_ = auVar112._20_4_ * fStack_6ec;
        auVar227._28_36_ = auVar206._28_36_;
        auVar227._24_4_ = auVar112._24_4_ * fStack_6e8;
        auVar206._0_4_ = auVar112._0_4_ * (float)local_720._0_4_;
        auVar206._4_4_ = auVar112._4_4_ * (float)local_720._4_4_;
        auVar206._8_4_ = auVar112._8_4_ * fStack_718;
        auVar206._12_4_ = auVar112._12_4_ * fStack_714;
        auVar206._16_4_ = auVar112._16_4_ * fStack_710;
        auVar206._20_4_ = auVar112._20_4_ * fStack_70c;
        auVar206._28_36_ = auVar200._28_36_;
        auVar206._24_4_ = auVar112._24_4_ * fStack_708;
        auVar101 = vmulps_avx512vl(local_360,auVar112);
        auVar102 = vfmadd231ps_avx512vl(auVar227._0_32_,auVar113,local_6c0);
        auVar111 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar113,local_6e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,local_340);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,local_680);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_6a0);
        auVar103 = vfmadd231ps_avx512vl(auVar101,auVar114,local_320);
        auVar92 = vfmadd231ps_fma(auVar102,auVar100,local_640);
        auVar206 = ZEXT1664(auVar92);
        auVar97 = vfmadd231ps_fma(auVar111,auVar100,local_660);
        auVar200 = ZEXT1664(auVar97);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 * 4 + lVar60);
        auVar102 = *(undefined1 (*) [32])(lVar60 + 0x21acb88 + lVar82 * 4);
        auVar106 = vfmadd231ps_avx512vl(auVar103,auVar100,local_380);
        auVar111 = *(undefined1 (*) [32])(lVar60 + 0x21ad00c + lVar82 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar60 + 0x21ad490 + lVar82 * 4);
        auVar212._0_4_ = auVar103._0_4_ * (float)local_700._0_4_;
        auVar212._4_4_ = auVar103._4_4_ * (float)local_700._4_4_;
        auVar212._8_4_ = auVar103._8_4_ * fStack_6f8;
        auVar212._12_4_ = auVar103._12_4_ * fStack_6f4;
        auVar212._16_4_ = auVar103._16_4_ * fStack_6f0;
        auVar212._20_4_ = auVar103._20_4_ * fStack_6ec;
        auVar212._28_36_ = auVar211._28_36_;
        auVar212._24_4_ = auVar103._24_4_ * fStack_6e8;
        auVar43._4_4_ = auVar103._4_4_ * (float)local_720._4_4_;
        auVar43._0_4_ = auVar103._0_4_ * (float)local_720._0_4_;
        auVar43._8_4_ = auVar103._8_4_ * fStack_718;
        auVar43._12_4_ = auVar103._12_4_ * fStack_714;
        auVar43._16_4_ = auVar103._16_4_ * fStack_710;
        auVar43._20_4_ = auVar103._20_4_ * fStack_70c;
        auVar43._24_4_ = auVar103._24_4_ * fStack_708;
        auVar43._28_4_ = uStack_704;
        auVar104 = vmulps_avx512vl(local_360,auVar103);
        auVar105 = vfmadd231ps_avx512vl(auVar212._0_32_,auVar111,local_6c0);
        auVar107 = vfmadd231ps_avx512vl(auVar43,auVar111,local_6e0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_680);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,local_6a0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_320);
        auVar95 = vfmadd231ps_fma(auVar105,auVar101,local_640);
        auVar211 = ZEXT1664(auVar95);
        auVar24 = vfmadd231ps_fma(auVar107,auVar101,local_660);
        auVar107 = vfmadd231ps_avx512vl(auVar104,auVar101,local_380);
        auVar108 = vmaxps_avx512vl(auVar106,auVar107);
        auVar104 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar92));
        auVar105 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar97));
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar97),auVar104);
        auVar110 = vmulps_avx512vl(ZEXT1632(auVar92),auVar105);
        auVar109 = vsubps_avx512vl(auVar109,auVar110);
        auVar110 = vmulps_avx512vl(auVar105,auVar105);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar104);
        auVar108 = vmulps_avx512vl(auVar108,auVar108);
        auVar108 = vmulps_avx512vl(auVar108,auVar110);
        auVar109 = vmulps_avx512vl(auVar109,auVar109);
        uVar30 = vcmpps_avx512vl(auVar109,auVar108,2);
        bVar86 = (byte)uVar31 & (byte)uVar30;
        if (bVar86 != 0) {
          in_ZMM25 = ZEXT3264(local_4e0);
          auVar103 = vmulps_avx512vl(local_4e0,auVar103);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_4c0,auVar103);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar111);
          local_7e0 = auVar228._0_32_;
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_7e0,auVar102);
          auVar112 = vmulps_avx512vl(local_4e0,auVar112);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_4c0,auVar112);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_4a0,auVar113);
          auVar102 = vfmadd213ps_avx512vl(auVar100,local_7e0,auVar114);
          auVar100 = *(undefined1 (*) [32])(lVar60 + 0x21ab4f4 + lVar82 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar60 + 0x21ab978 + lVar82 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar60 + 0x21abdfc + lVar82 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar60 + 0x21ac280 + lVar82 * 4);
          auVar111 = vmulps_avx512vl(_local_700,auVar112);
          auVar103 = vmulps_avx512vl(_local_720,auVar112);
          auVar112 = vmulps_avx512vl(local_4e0,auVar112);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar113,local_6c0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_6e0);
          auVar113 = vfmadd231ps_avx512vl(auVar112,local_4c0,auVar113);
          auVar112 = vfmadd231ps_avx512vl(auVar111,auVar114,local_680);
          auVar111 = vfmadd231ps_avx512vl(auVar103,auVar114,local_6a0);
          auVar114 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar114);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar100,local_640);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,local_660);
          auVar103 = vfmadd231ps_avx512vl(auVar114,local_7e0,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar60 + 0x21ad914 + lVar82 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar60 + 0x21ae21c + lVar82 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar60 + 0x21ae6a0 + lVar82 * 4);
          auVar108 = vmulps_avx512vl(_local_700,auVar113);
          auVar109 = vmulps_avx512vl(_local_720,auVar113);
          auVar113 = vmulps_avx512vl(local_4e0,auVar113);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_6c0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_6e0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,local_4c0,auVar114);
          auVar114 = *(undefined1 (*) [32])(lVar60 + 0x21add98 + lVar82 * 4);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_680);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_6a0);
          auVar114 = vfmadd231ps_avx512vl(auVar113,local_4a0,auVar114);
          auVar113 = vfmadd231ps_avx512vl(auVar108,auVar100,local_640);
          auVar108 = vfmadd231ps_avx512vl(auVar109,auVar100,local_660);
          auVar114 = vfmadd231ps_avx512vl(auVar114,local_7e0,auVar100);
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar112,auVar109);
          vandps_avx512vl(auVar111,auVar109);
          auVar100 = vmaxps_avx(auVar109,auVar109);
          vandps_avx512vl(auVar103,auVar109);
          auVar100 = vmaxps_avx(auVar100,auVar109);
          uVar77 = vcmpps_avx512vl(auVar100,local_7c0,1);
          bVar10 = (bool)((byte)uVar77 & 1);
          auVar125._0_4_ = (float)((uint)bVar10 * auVar104._0_4_ | (uint)!bVar10 * auVar112._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar112._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar112._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar112._12_4_);
          bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * auVar112._16_4_);
          bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * auVar112._20_4_);
          bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * auVar112._24_4_);
          bVar10 = SUB81(uVar77 >> 7,0);
          auVar125._28_4_ = (uint)bVar10 * auVar104._28_4_ | (uint)!bVar10 * auVar112._28_4_;
          bVar10 = (bool)((byte)uVar77 & 1);
          auVar126._0_4_ = (float)((uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * auVar111._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar111._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar111._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar111._12_4_);
          bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar126._16_4_ =
               (float)((uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar111._16_4_);
          bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar126._20_4_ =
               (float)((uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar111._20_4_);
          bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar126._24_4_ =
               (float)((uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar111._24_4_);
          bVar10 = SUB81(uVar77 >> 7,0);
          auVar126._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar111._28_4_;
          vandps_avx512vl(auVar113,auVar109);
          vandps_avx512vl(auVar108,auVar109);
          auVar100 = vmaxps_avx(auVar126,auVar126);
          vandps_avx512vl(auVar114,auVar109);
          auVar100 = vmaxps_avx(auVar100,auVar126);
          uVar77 = vcmpps_avx512vl(auVar100,local_7c0,1);
          bVar10 = (bool)((byte)uVar77 & 1);
          auVar127._0_4_ = (uint)bVar10 * auVar104._0_4_ | (uint)!bVar10 * auVar113._0_4_;
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar10 * auVar104._4_4_ | (uint)!bVar10 * auVar113._4_4_;
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar10 * auVar104._8_4_ | (uint)!bVar10 * auVar113._8_4_;
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar10 * auVar104._12_4_ | (uint)!bVar10 * auVar113._12_4_;
          bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar127._16_4_ = (uint)bVar10 * auVar104._16_4_ | (uint)!bVar10 * auVar113._16_4_;
          bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar127._20_4_ = (uint)bVar10 * auVar104._20_4_ | (uint)!bVar10 * auVar113._20_4_;
          bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar127._24_4_ = (uint)bVar10 * auVar104._24_4_ | (uint)!bVar10 * auVar113._24_4_;
          bVar10 = SUB81(uVar77 >> 7,0);
          auVar127._28_4_ = (uint)bVar10 * auVar104._28_4_ | (uint)!bVar10 * auVar113._28_4_;
          bVar10 = (bool)((byte)uVar77 & 1);
          auVar128._0_4_ = (float)((uint)bVar10 * auVar105._0_4_ | (uint)!bVar10 * auVar108._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar10 * auVar105._4_4_ | (uint)!bVar10 * auVar108._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar10 * auVar105._8_4_ | (uint)!bVar10 * auVar108._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar10 * auVar105._12_4_ | (uint)!bVar10 * auVar108._12_4_);
          bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar10 * auVar105._16_4_ | (uint)!bVar10 * auVar108._16_4_);
          bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar10 * auVar105._20_4_ | (uint)!bVar10 * auVar108._20_4_);
          bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar10 * auVar105._24_4_ | (uint)!bVar10 * auVar108._24_4_);
          bVar10 = SUB81(uVar77 >> 7,0);
          auVar128._28_4_ = (uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar108._28_4_;
          auVar215._8_4_ = 0x80000000;
          auVar215._0_8_ = 0x8000000080000000;
          auVar215._12_4_ = 0x80000000;
          auVar215._16_4_ = 0x80000000;
          auVar215._20_4_ = 0x80000000;
          auVar215._24_4_ = 0x80000000;
          auVar215._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar127,auVar215);
          auVar99 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar114 = vfmadd213ps_avx512vl(auVar125,auVar125,ZEXT1632(auVar99));
          auVar26 = vfmadd231ps_fma(auVar114,auVar126,auVar126);
          auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar26));
          auVar225._8_4_ = 0xbf000000;
          auVar225._0_8_ = 0xbf000000bf000000;
          auVar225._12_4_ = 0xbf000000;
          auVar225._16_4_ = 0xbf000000;
          auVar225._20_4_ = 0xbf000000;
          auVar225._24_4_ = 0xbf000000;
          auVar225._28_4_ = 0xbf000000;
          fVar166 = auVar114._0_4_;
          fVar213 = auVar114._4_4_;
          fVar214 = auVar114._8_4_;
          fVar162 = auVar114._12_4_;
          fVar179 = auVar114._16_4_;
          fVar190 = auVar114._20_4_;
          fVar191 = auVar114._24_4_;
          auVar44._4_4_ = fVar213 * fVar213 * fVar213 * auVar26._4_4_ * -0.5;
          auVar44._0_4_ = fVar166 * fVar166 * fVar166 * auVar26._0_4_ * -0.5;
          auVar44._8_4_ = fVar214 * fVar214 * fVar214 * auVar26._8_4_ * -0.5;
          auVar44._12_4_ = fVar162 * fVar162 * fVar162 * auVar26._12_4_ * -0.5;
          auVar44._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar44._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar44._24_4_ = fVar191 * fVar191 * fVar191 * -0.0;
          auVar44._28_4_ = auVar126._28_4_;
          auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar114 = vfmadd231ps_avx512vl(auVar44,auVar113,auVar114);
          auVar45._4_4_ = auVar126._4_4_ * auVar114._4_4_;
          auVar45._0_4_ = auVar126._0_4_ * auVar114._0_4_;
          auVar45._8_4_ = auVar126._8_4_ * auVar114._8_4_;
          auVar45._12_4_ = auVar126._12_4_ * auVar114._12_4_;
          auVar45._16_4_ = auVar126._16_4_ * auVar114._16_4_;
          auVar45._20_4_ = auVar126._20_4_ * auVar114._20_4_;
          auVar45._24_4_ = auVar126._24_4_ * auVar114._24_4_;
          auVar45._28_4_ = 0;
          auVar46._4_4_ = auVar114._4_4_ * -auVar125._4_4_;
          auVar46._0_4_ = auVar114._0_4_ * -auVar125._0_4_;
          auVar46._8_4_ = auVar114._8_4_ * -auVar125._8_4_;
          auVar46._12_4_ = auVar114._12_4_ * -auVar125._12_4_;
          auVar46._16_4_ = auVar114._16_4_ * -auVar125._16_4_;
          auVar46._20_4_ = auVar114._20_4_ * -auVar125._20_4_;
          auVar46._24_4_ = auVar114._24_4_ * -auVar125._24_4_;
          auVar46._28_4_ = auVar126._28_4_;
          auVar112 = vmulps_avx512vl(auVar114,ZEXT1632(auVar99));
          auVar103 = ZEXT1632(auVar99);
          auVar114 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar103);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar128,auVar128);
          auVar111 = vrsqrt14ps_avx512vl(auVar114);
          auVar114 = vmulps_avx512vl(auVar114,auVar225);
          fVar166 = auVar111._0_4_;
          fVar213 = auVar111._4_4_;
          fVar214 = auVar111._8_4_;
          fVar162 = auVar111._12_4_;
          fVar179 = auVar111._16_4_;
          fVar190 = auVar111._20_4_;
          fVar191 = auVar111._24_4_;
          auVar47._4_4_ = fVar213 * fVar213 * fVar213 * auVar114._4_4_;
          auVar47._0_4_ = fVar166 * fVar166 * fVar166 * auVar114._0_4_;
          auVar47._8_4_ = fVar214 * fVar214 * fVar214 * auVar114._8_4_;
          auVar47._12_4_ = fVar162 * fVar162 * fVar162 * auVar114._12_4_;
          auVar47._16_4_ = fVar179 * fVar179 * fVar179 * auVar114._16_4_;
          auVar47._20_4_ = fVar190 * fVar190 * fVar190 * auVar114._20_4_;
          auVar47._24_4_ = fVar191 * fVar191 * fVar191 * auVar114._24_4_;
          auVar47._28_4_ = auVar114._28_4_;
          auVar114 = vfmadd231ps_avx512vl(auVar47,auVar113,auVar111);
          auVar48._4_4_ = auVar128._4_4_ * auVar114._4_4_;
          auVar48._0_4_ = auVar128._0_4_ * auVar114._0_4_;
          auVar48._8_4_ = auVar128._8_4_ * auVar114._8_4_;
          auVar48._12_4_ = auVar128._12_4_ * auVar114._12_4_;
          auVar48._16_4_ = auVar128._16_4_ * auVar114._16_4_;
          auVar48._20_4_ = auVar128._20_4_ * auVar114._20_4_;
          auVar48._24_4_ = auVar128._24_4_ * auVar114._24_4_;
          auVar48._28_4_ = auVar111._28_4_;
          auVar49._4_4_ = auVar114._4_4_ * auVar100._4_4_;
          auVar49._0_4_ = auVar114._0_4_ * auVar100._0_4_;
          auVar49._8_4_ = auVar114._8_4_ * auVar100._8_4_;
          auVar49._12_4_ = auVar114._12_4_ * auVar100._12_4_;
          auVar49._16_4_ = auVar114._16_4_ * auVar100._16_4_;
          auVar49._20_4_ = auVar114._20_4_ * auVar100._20_4_;
          auVar49._24_4_ = auVar114._24_4_ * auVar100._24_4_;
          auVar49._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar114,auVar103);
          auVar26 = vfmadd213ps_fma(auVar45,auVar106,ZEXT1632(auVar92));
          auVar27 = vfmadd213ps_fma(auVar46,auVar106,ZEXT1632(auVar97));
          auVar113 = vfmadd213ps_avx512vl(auVar112,auVar106,auVar102);
          auVar111 = vfmadd213ps_avx512vl(auVar48,auVar107,ZEXT1632(auVar95));
          auVar29 = vfnmadd213ps_fma(auVar45,auVar106,ZEXT1632(auVar92));
          auVar92 = vfmadd213ps_fma(auVar49,auVar107,ZEXT1632(auVar24));
          auVar93 = vfnmadd213ps_fma(auVar46,auVar106,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar100,auVar107,auVar101);
          auVar96 = vfnmadd231ps_fma(auVar102,auVar106,auVar112);
          auVar91 = vfnmadd213ps_fma(auVar48,auVar107,ZEXT1632(auVar95));
          auVar90 = vfnmadd213ps_fma(auVar49,auVar107,ZEXT1632(auVar24));
          auVar98 = vfnmadd231ps_fma(auVar101,auVar107,auVar100);
          auVar101 = vsubps_avx512vl(auVar111,ZEXT1632(auVar29));
          auVar100 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar93));
          auVar114 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar96));
          auVar50._4_4_ = auVar100._4_4_ * auVar96._4_4_;
          auVar50._0_4_ = auVar100._0_4_ * auVar96._0_4_;
          auVar50._8_4_ = auVar100._8_4_ * auVar96._8_4_;
          auVar50._12_4_ = auVar100._12_4_ * auVar96._12_4_;
          auVar50._16_4_ = auVar100._16_4_ * 0.0;
          auVar50._20_4_ = auVar100._20_4_ * 0.0;
          auVar50._24_4_ = auVar100._24_4_ * 0.0;
          auVar50._28_4_ = auVar112._28_4_;
          auVar95 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar93),auVar114);
          auVar51._4_4_ = auVar114._4_4_ * auVar29._4_4_;
          auVar51._0_4_ = auVar114._0_4_ * auVar29._0_4_;
          auVar51._8_4_ = auVar114._8_4_ * auVar29._8_4_;
          auVar51._12_4_ = auVar114._12_4_ * auVar29._12_4_;
          auVar51._16_4_ = auVar114._16_4_ * 0.0;
          auVar51._20_4_ = auVar114._20_4_ * 0.0;
          auVar51._24_4_ = auVar114._24_4_ * 0.0;
          auVar51._28_4_ = auVar114._28_4_;
          auVar24 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar96),auVar101);
          auVar52._4_4_ = auVar93._4_4_ * auVar101._4_4_;
          auVar52._0_4_ = auVar93._0_4_ * auVar101._0_4_;
          auVar52._8_4_ = auVar93._8_4_ * auVar101._8_4_;
          auVar52._12_4_ = auVar93._12_4_ * auVar101._12_4_;
          auVar52._16_4_ = auVar101._16_4_ * 0.0;
          auVar52._20_4_ = auVar101._20_4_ * 0.0;
          auVar52._24_4_ = auVar101._24_4_ * 0.0;
          auVar52._28_4_ = auVar101._28_4_;
          auVar28 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar29),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar103,ZEXT1632(auVar24));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,ZEXT1632(auVar95));
          auVar109 = ZEXT1632(auVar99);
          uVar77 = vcmpps_avx512vl(auVar100,auVar109,2);
          bVar76 = (byte)uVar77;
          fVar88 = (float)((uint)(bVar76 & 1) * auVar26._0_4_ |
                          (uint)!(bool)(bVar76 & 1) * auVar91._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar138 = (float)((uint)bVar10 * auVar26._4_4_ | (uint)!bVar10 * auVar91._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar140 = (float)((uint)bVar10 * auVar26._8_4_ | (uint)!bVar10 * auVar91._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar142 = (float)((uint)bVar10 * auVar26._12_4_ | (uint)!bVar10 * auVar91._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar88))));
          fVar89 = (float)((uint)(bVar76 & 1) * auVar27._0_4_ |
                          (uint)!(bool)(bVar76 & 1) * auVar90._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          fVar139 = (float)((uint)bVar10 * auVar27._4_4_ | (uint)!bVar10 * auVar90._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          fVar141 = (float)((uint)bVar10 * auVar27._8_4_ | (uint)!bVar10 * auVar90._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          fVar143 = (float)((uint)bVar10 * auVar27._12_4_ | (uint)!bVar10 * auVar90._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar89))));
          auVar129._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar113._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar98._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar10 * auVar113._4_4_ | (uint)!bVar10 * auVar98._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar10 * auVar113._8_4_ | (uint)!bVar10 * auVar98._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar10 * auVar113._12_4_ | (uint)!bVar10 * auVar98._12_4_)
          ;
          fVar214 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar113._16_4_);
          auVar129._16_4_ = fVar214;
          fVar213 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar113._20_4_);
          auVar129._20_4_ = fVar213;
          fVar166 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar113._24_4_);
          auVar129._24_4_ = fVar166;
          iVar1 = (uint)(byte)(uVar77 >> 7) * auVar113._28_4_;
          auVar129._28_4_ = iVar1;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar29),auVar111);
          auVar130._0_4_ =
               (uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar95._0_4_;
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar95._4_4_;
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar95._8_4_;
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar95._12_4_;
          auVar130._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_;
          auVar130._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_;
          auVar130._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_;
          auVar130._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar92));
          auVar131._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar26._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar26._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar26._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar26._12_4_)
          ;
          fVar179 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
          auVar131._16_4_ = fVar179;
          fVar162 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
          auVar131._20_4_ = fVar162;
          fVar190 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
          auVar131._24_4_ = fVar190;
          auVar131._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar97));
          auVar132._0_4_ =
               (float)((uint)(bVar76 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar76 & 1) * auVar27._0_4_);
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar27._4_4_);
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar27._8_4_);
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar27._12_4_)
          ;
          fVar191 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar100._16_4_);
          auVar132._16_4_ = fVar191;
          fVar192 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar100._20_4_);
          auVar132._20_4_ = fVar192;
          fVar193 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar100._24_4_);
          auVar132._24_4_ = fVar193;
          iVar2 = (uint)(byte)(uVar77 >> 7) * auVar100._28_4_;
          auVar132._28_4_ = iVar2;
          auVar133._0_4_ =
               (uint)(bVar76 & 1) * (int)auVar29._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar111._0_4_;
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar10 * (int)auVar29._4_4_ | (uint)!bVar10 * auVar111._4_4_;
          bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar10 * (int)auVar29._8_4_ | (uint)!bVar10 * auVar111._8_4_;
          bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar10 * (int)auVar29._12_4_ | (uint)!bVar10 * auVar111._12_4_;
          auVar133._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_;
          auVar133._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_;
          auVar133._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_;
          auVar133._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar111._28_4_;
          bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar111 = vsubps_avx512vl(auVar133,auVar103);
          auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar93._12_4_ |
                                                   (uint)!bVar14 * auVar92._12_4_,
                                                   CONCAT48((uint)bVar12 * (int)auVar93._8_4_ |
                                                            (uint)!bVar12 * auVar92._8_4_,
                                                            CONCAT44((uint)bVar10 *
                                                                     (int)auVar93._4_4_ |
                                                                     (uint)!bVar10 * auVar92._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar93._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar92._0_4_)))),auVar104);
          auVar206 = ZEXT3264(auVar114);
          auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar96._12_4_ |
                                                   (uint)!bVar15 * auVar97._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar96._8_4_ |
                                                            (uint)!bVar13 * auVar97._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar96._4_4_ |
                                                                     (uint)!bVar11 * auVar97._4_4_,
                                                                     (uint)(bVar76 & 1) *
                                                                     (int)auVar96._0_4_ |
                                                                     (uint)!(bool)(bVar76 & 1) *
                                                                     auVar97._0_4_)))),auVar129);
          auVar112 = vsubps_avx(auVar103,auVar130);
          auVar211 = ZEXT3264(auVar112);
          auVar101 = vsubps_avx(auVar104,auVar131);
          auVar102 = vsubps_avx(auVar129,auVar132);
          auVar53._4_4_ = auVar113._4_4_ * fVar138;
          auVar53._0_4_ = auVar113._0_4_ * fVar88;
          auVar53._8_4_ = auVar113._8_4_ * fVar140;
          auVar53._12_4_ = auVar113._12_4_ * fVar142;
          auVar53._16_4_ = auVar113._16_4_ * 0.0;
          auVar53._20_4_ = auVar113._20_4_ * 0.0;
          auVar53._24_4_ = auVar113._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar53,auVar129,auVar111);
          auVar188._0_4_ = fVar89 * auVar111._0_4_;
          auVar188._4_4_ = fVar139 * auVar111._4_4_;
          auVar188._8_4_ = fVar141 * auVar111._8_4_;
          auVar188._12_4_ = fVar143 * auVar111._12_4_;
          auVar188._16_4_ = auVar111._16_4_ * 0.0;
          auVar188._20_4_ = auVar111._20_4_ * 0.0;
          auVar188._24_4_ = auVar111._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar188,auVar103,auVar114);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar109,ZEXT1632(auVar92));
          auVar198._0_4_ = auVar114._0_4_ * auVar129._0_4_;
          auVar198._4_4_ = auVar114._4_4_ * auVar129._4_4_;
          auVar198._8_4_ = auVar114._8_4_ * auVar129._8_4_;
          auVar198._12_4_ = auVar114._12_4_ * auVar129._12_4_;
          auVar198._16_4_ = auVar114._16_4_ * fVar214;
          auVar198._20_4_ = auVar114._20_4_ * fVar213;
          auVar198._24_4_ = auVar114._24_4_ * fVar166;
          auVar198._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar198,auVar104,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar109,ZEXT1632(auVar92));
          auVar100 = vmulps_avx512vl(auVar102,auVar130);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar112,auVar132);
          auVar54._4_4_ = auVar101._4_4_ * auVar132._4_4_;
          auVar54._0_4_ = auVar101._0_4_ * auVar132._0_4_;
          auVar54._8_4_ = auVar101._8_4_ * auVar132._8_4_;
          auVar54._12_4_ = auVar101._12_4_ * auVar132._12_4_;
          auVar54._16_4_ = auVar101._16_4_ * fVar191;
          auVar54._20_4_ = auVar101._20_4_ * fVar192;
          auVar54._24_4_ = auVar101._24_4_ * fVar193;
          auVar54._28_4_ = iVar2;
          auVar92 = vfmsub231ps_fma(auVar54,auVar131,auVar102);
          auVar199._0_4_ = auVar131._0_4_ * auVar112._0_4_;
          auVar199._4_4_ = auVar131._4_4_ * auVar112._4_4_;
          auVar199._8_4_ = auVar131._8_4_ * auVar112._8_4_;
          auVar199._12_4_ = auVar131._12_4_ * auVar112._12_4_;
          auVar199._16_4_ = fVar179 * auVar112._16_4_;
          auVar199._20_4_ = fVar162 * auVar112._20_4_;
          auVar199._24_4_ = fVar190 * auVar112._24_4_;
          auVar199._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar199,auVar101,auVar130);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar109,auVar100);
          auVar108 = vfmadd231ps_avx512vl(auVar100,auVar109,ZEXT1632(auVar92));
          auVar200 = ZEXT3264(auVar108);
          auVar100 = vmaxps_avx(auVar105,auVar108);
          uVar30 = vcmpps_avx512vl(auVar100,auVar109,2);
          bVar86 = bVar86 & (byte)uVar30;
          if (bVar86 != 0) {
            uVar144 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar226._4_4_ = uVar144;
            auVar226._0_4_ = uVar144;
            auVar226._8_4_ = uVar144;
            auVar226._12_4_ = uVar144;
            auVar226._16_4_ = uVar144;
            auVar226._20_4_ = uVar144;
            auVar226._24_4_ = uVar144;
            auVar226._28_4_ = uVar144;
            auVar227 = ZEXT3264(auVar226);
            auVar55._4_4_ = auVar102._4_4_ * auVar114._4_4_;
            auVar55._0_4_ = auVar102._0_4_ * auVar114._0_4_;
            auVar55._8_4_ = auVar102._8_4_ * auVar114._8_4_;
            auVar55._12_4_ = auVar102._12_4_ * auVar114._12_4_;
            auVar55._16_4_ = auVar102._16_4_ * auVar114._16_4_;
            auVar55._20_4_ = auVar102._20_4_ * auVar114._20_4_;
            auVar55._24_4_ = auVar102._24_4_ * auVar114._24_4_;
            auVar55._28_4_ = auVar100._28_4_;
            auVar24 = vfmsub231ps_fma(auVar55,auVar101,auVar113);
            auVar56._4_4_ = auVar113._4_4_ * auVar112._4_4_;
            auVar56._0_4_ = auVar113._0_4_ * auVar112._0_4_;
            auVar56._8_4_ = auVar113._8_4_ * auVar112._8_4_;
            auVar56._12_4_ = auVar113._12_4_ * auVar112._12_4_;
            auVar56._16_4_ = auVar113._16_4_ * auVar112._16_4_;
            auVar56._20_4_ = auVar113._20_4_ * auVar112._20_4_;
            auVar56._24_4_ = auVar113._24_4_ * auVar112._24_4_;
            auVar56._28_4_ = auVar113._28_4_;
            auVar95 = vfmsub231ps_fma(auVar56,auVar111,auVar102);
            auVar57._4_4_ = auVar101._4_4_ * auVar111._4_4_;
            auVar57._0_4_ = auVar101._0_4_ * auVar111._0_4_;
            auVar57._8_4_ = auVar101._8_4_ * auVar111._8_4_;
            auVar57._12_4_ = auVar101._12_4_ * auVar111._12_4_;
            auVar57._16_4_ = auVar101._16_4_ * auVar111._16_4_;
            auVar57._20_4_ = auVar101._20_4_ * auVar111._20_4_;
            auVar57._24_4_ = auVar101._24_4_ * auVar111._24_4_;
            auVar57._28_4_ = auVar101._28_4_;
            auVar26 = vfmsub231ps_fma(auVar57,auVar112,auVar114);
            auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar26));
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar24),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar100 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar35._16_4_ = 0x3f800000;
            auVar35._20_4_ = 0x3f800000;
            auVar35._24_4_ = 0x3f800000;
            auVar35._28_4_ = 0x3f800000;
            auVar114 = vfnmadd213ps_avx512vl(auVar100,ZEXT1632(auVar97),auVar35);
            auVar92 = vfmadd132ps_fma(auVar114,auVar100,auVar100);
            auVar206 = ZEXT1664(auVar92);
            auVar58._4_4_ = auVar26._4_4_ * auVar129._4_4_;
            auVar58._0_4_ = auVar26._0_4_ * auVar129._0_4_;
            auVar58._8_4_ = auVar26._8_4_ * auVar129._8_4_;
            auVar58._12_4_ = auVar26._12_4_ * auVar129._12_4_;
            auVar58._16_4_ = fVar214 * 0.0;
            auVar58._20_4_ = fVar213 * 0.0;
            auVar58._24_4_ = fVar166 * 0.0;
            auVar58._28_4_ = iVar1;
            auVar95 = vfmadd231ps_fma(auVar58,auVar104,ZEXT1632(auVar95));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar103,ZEXT1632(auVar24));
            fVar166 = auVar92._0_4_;
            fVar213 = auVar92._4_4_;
            fVar214 = auVar92._8_4_;
            fVar162 = auVar92._12_4_;
            local_5e0._28_4_ = auVar100._28_4_;
            local_5e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar95._12_4_ * fVar162,
                                    CONCAT48(auVar95._8_4_ * fVar214,
                                             CONCAT44(auVar95._4_4_ * fVar213,
                                                      auVar95._0_4_ * fVar166))));
            auVar211 = ZEXT3264(local_5e0);
            uVar30 = vcmpps_avx512vl(local_5e0,auVar226,2);
            auVar74._4_4_ = uStack_79c;
            auVar74._0_4_ = local_7a0;
            auVar74._8_4_ = uStack_798;
            auVar74._12_4_ = uStack_794;
            auVar74._16_4_ = uStack_790;
            auVar74._20_4_ = uStack_78c;
            auVar74._24_4_ = uStack_788;
            auVar74._28_4_ = uStack_784;
            uVar31 = vcmpps_avx512vl(local_5e0,auVar74,0xd);
            bVar86 = (byte)uVar30 & (byte)uVar31 & bVar86;
            if (bVar86 != 0) {
              uVar87 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar87 = bVar86 & uVar87;
              if ((char)uVar87 != '\0') {
                fVar179 = auVar105._0_4_ * fVar166;
                fVar190 = auVar105._4_4_ * fVar213;
                auVar59._4_4_ = fVar190;
                auVar59._0_4_ = fVar179;
                fVar191 = auVar105._8_4_ * fVar214;
                auVar59._8_4_ = fVar191;
                fVar192 = auVar105._12_4_ * fVar162;
                auVar59._12_4_ = fVar192;
                fVar193 = auVar105._16_4_ * 0.0;
                auVar59._16_4_ = fVar193;
                fVar88 = auVar105._20_4_ * 0.0;
                auVar59._20_4_ = fVar88;
                fVar89 = auVar105._24_4_ * 0.0;
                auVar59._24_4_ = fVar89;
                auVar59._28_4_ = auVar105._28_4_;
                auVar178._8_4_ = 0x3f800000;
                auVar178._0_8_ = 0x3f8000003f800000;
                auVar178._12_4_ = 0x3f800000;
                auVar178._16_4_ = 0x3f800000;
                auVar178._20_4_ = 0x3f800000;
                auVar178._24_4_ = 0x3f800000;
                auVar178._28_4_ = 0x3f800000;
                auVar100 = vsubps_avx(auVar178,auVar59);
                local_620._0_4_ =
                     (float)((uint)(bVar76 & 1) * (int)fVar179 |
                            (uint)!(bool)(bVar76 & 1) * auVar100._0_4_);
                bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
                local_620._4_4_ =
                     (float)((uint)bVar10 * (int)fVar190 | (uint)!bVar10 * auVar100._4_4_);
                bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
                local_620._8_4_ =
                     (float)((uint)bVar10 * (int)fVar191 | (uint)!bVar10 * auVar100._8_4_);
                bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
                local_620._12_4_ =
                     (float)((uint)bVar10 * (int)fVar192 | (uint)!bVar10 * auVar100._12_4_);
                bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
                local_620._16_4_ =
                     (float)((uint)bVar10 * (int)fVar193 | (uint)!bVar10 * auVar100._16_4_);
                bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
                local_620._20_4_ =
                     (float)((uint)bVar10 * (int)fVar88 | (uint)!bVar10 * auVar100._20_4_);
                bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
                local_620._24_4_ =
                     (float)((uint)bVar10 * (int)fVar89 | (uint)!bVar10 * auVar100._24_4_);
                bVar10 = SUB81(uVar77 >> 7,0);
                local_620._28_4_ =
                     (float)((uint)bVar10 * auVar105._28_4_ | (uint)!bVar10 * auVar100._28_4_);
                auVar100 = vsubps_avx(auVar107,auVar106);
                auVar92 = vfmadd213ps_fma(auVar100,local_620,auVar106);
                uVar144 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar36._4_4_ = uVar144;
                auVar36._0_4_ = uVar144;
                auVar36._8_4_ = uVar144;
                auVar36._12_4_ = uVar144;
                auVar36._16_4_ = uVar144;
                auVar36._20_4_ = uVar144;
                auVar36._24_4_ = uVar144;
                auVar36._28_4_ = uVar144;
                auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                              CONCAT48(auVar92._8_4_ + auVar92._8_4_
                                                                       ,CONCAT44(auVar92._4_4_ +
                                                                                 auVar92._4_4_,
                                                                                 auVar92._0_4_ +
                                                                                 auVar92._0_4_)))),
                                           auVar36);
                uVar32 = vcmpps_avx512vl(local_5e0,auVar100,6);
                uVar87 = uVar87 & uVar32;
                bVar86 = (byte)uVar87;
                if (bVar86 != 0) {
                  auVar165._0_4_ = auVar108._0_4_ * fVar166;
                  auVar165._4_4_ = auVar108._4_4_ * fVar213;
                  auVar165._8_4_ = auVar108._8_4_ * fVar214;
                  auVar165._12_4_ = auVar108._12_4_ * fVar162;
                  auVar165._16_4_ = auVar108._16_4_ * 0.0;
                  auVar165._20_4_ = auVar108._20_4_ * 0.0;
                  auVar165._24_4_ = auVar108._24_4_ * 0.0;
                  auVar165._28_4_ = 0;
                  auVar189._8_4_ = 0x3f800000;
                  auVar189._0_8_ = 0x3f8000003f800000;
                  auVar189._12_4_ = 0x3f800000;
                  auVar189._16_4_ = 0x3f800000;
                  auVar189._20_4_ = 0x3f800000;
                  auVar189._24_4_ = 0x3f800000;
                  auVar189._28_4_ = 0x3f800000;
                  auVar100 = vsubps_avx(auVar189,auVar165);
                  auVar134._0_4_ =
                       (uint)(bVar76 & 1) * (int)auVar165._0_4_ |
                       (uint)!(bool)(bVar76 & 1) * auVar100._0_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
                  auVar134._4_4_ =
                       (uint)bVar10 * (int)auVar165._4_4_ | (uint)!bVar10 * auVar100._4_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
                  auVar134._8_4_ =
                       (uint)bVar10 * (int)auVar165._8_4_ | (uint)!bVar10 * auVar100._8_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
                  auVar134._12_4_ =
                       (uint)bVar10 * (int)auVar165._12_4_ | (uint)!bVar10 * auVar100._12_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
                  auVar134._16_4_ =
                       (uint)bVar10 * (int)auVar165._16_4_ | (uint)!bVar10 * auVar100._16_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
                  auVar134._20_4_ =
                       (uint)bVar10 * (int)auVar165._20_4_ | (uint)!bVar10 * auVar100._20_4_;
                  bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
                  auVar134._24_4_ =
                       (uint)bVar10 * (int)auVar165._24_4_ | (uint)!bVar10 * auVar100._24_4_;
                  auVar134._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar100._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_600 = vfmsub132ps_avx512vl(auVar134,auVar189,auVar37);
                  local_5c0 = (undefined4)lVar82;
                  local_5b0 = local_880;
                  uStack_5a8 = uStack_878;
                  local_5a0 = local_870;
                  uStack_598 = uStack_868;
                  local_590 = local_8a0;
                  uStack_588 = uStack_898;
                  local_580 = local_890;
                  uStack_578 = uStack_888;
                  pGVar83 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar92 = vcvtsi2ss_avx512f(auVar99,local_5c0);
                    fVar166 = auVar92._0_4_;
                    local_560[0] = (fVar166 + local_620._0_4_ + 0.0) * local_3a0;
                    local_560[1] = (fVar166 + local_620._4_4_ + 1.0) * fStack_39c;
                    local_560[2] = (fVar166 + local_620._8_4_ + 2.0) * fStack_398;
                    local_560[3] = (fVar166 + local_620._12_4_ + 3.0) * fStack_394;
                    fStack_550 = (fVar166 + local_620._16_4_ + 4.0) * fStack_390;
                    fStack_54c = (fVar166 + local_620._20_4_ + 5.0) * fStack_38c;
                    fStack_548 = (fVar166 + local_620._24_4_ + 6.0) * fStack_388;
                    fStack_544 = fVar166 + local_620._28_4_ + 7.0;
                    local_540 = local_600;
                    local_520 = local_5e0;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar100 = vblendmps_avx512vl(auVar153,local_5e0);
                    auVar135._0_4_ =
                         (uint)(bVar86 & 1) * auVar100._0_4_ |
                         (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar135._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar135._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar135._12_4_ = (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar135._16_4_ = (uint)bVar10 * auVar100._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar135._20_4_ = (uint)bVar10 * auVar100._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar135._24_4_ = (uint)bVar10 * auVar100._24_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = SUB81(uVar87 >> 7,0);
                    auVar135._28_4_ = (uint)bVar10 * auVar100._28_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar100 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar100 = vminps_avx(auVar135,auVar100);
                    auVar114 = vshufpd_avx(auVar100,auVar100,5);
                    auVar100 = vminps_avx(auVar100,auVar114);
                    auVar114 = vpermpd_avx2(auVar100,0x4e);
                    auVar100 = vminps_avx(auVar100,auVar114);
                    uVar30 = vcmpps_avx512vl(auVar135,auVar100,0);
                    uVar79 = (uint)uVar87;
                    if (((byte)uVar30 & bVar86) != 0) {
                      uVar79 = (uint)((byte)uVar30 & bVar86);
                    }
                    uVar80 = 0;
                    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                      uVar80 = uVar80 + 1;
                    }
                    uVar77 = (ulong)uVar80;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3c0 = vmovdqa64_avx512vl(auVar230._0_32_);
                      local_480._0_32_ = local_5e0;
                      local_820._0_8_ = pGVar83;
                      local_5bc = iVar7;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_560[uVar77]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_540 + uVar77 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_520 + uVar77 * 4);
                        local_858.context = context->user;
                        fVar162 = local_200._0_4_;
                        fVar213 = 1.0 - fVar162;
                        fVar166 = fVar213 * fVar213 * -3.0;
                        auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                                  ZEXT416((uint)(fVar162 * fVar213)),
                                                  ZEXT416(0xc0000000));
                        auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar162 * fVar213)),
                                                  ZEXT416((uint)(fVar162 * fVar162)),
                                                  ZEXT416(0x40000000));
                        fVar213 = auVar92._0_4_ * 3.0;
                        fVar214 = auVar97._0_4_ * 3.0;
                        fVar162 = fVar162 * fVar162 * 3.0;
                        auVar204._0_4_ = fVar162 * fVar159;
                        auVar204._4_4_ = fVar162 * fVar160;
                        auVar204._8_4_ = fVar162 * fVar161;
                        auVar204._12_4_ = fVar162 * fVar75;
                        auVar146._4_4_ = fVar214;
                        auVar146._0_4_ = fVar214;
                        auVar146._8_4_ = fVar214;
                        auVar146._12_4_ = fVar214;
                        auVar92 = vfmadd132ps_fma(auVar146,auVar204,auVar25);
                        auVar184._4_4_ = fVar213;
                        auVar184._0_4_ = fVar213;
                        auVar184._8_4_ = fVar213;
                        auVar184._12_4_ = fVar213;
                        auVar92 = vfmadd132ps_fma(auVar184,auVar92,auVar145);
                        auVar147._4_4_ = fVar166;
                        auVar147._0_4_ = fVar166;
                        auVar147._8_4_ = fVar166;
                        auVar147._12_4_ = fVar166;
                        auVar92 = vfmadd132ps_fma(auVar147,auVar92,auVar94);
                        auVar158 = vbroadcastss_avx512f(auVar92);
                        auVar229 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar200 = vpermps_avx512f(auVar229,ZEXT1664(auVar92));
                        auVar206 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar206,ZEXT1664(auVar92));
                        local_2c0[0] = (RTCHitN)auVar158[0];
                        local_2c0[1] = (RTCHitN)auVar158[1];
                        local_2c0[2] = (RTCHitN)auVar158[2];
                        local_2c0[3] = (RTCHitN)auVar158[3];
                        local_2c0[4] = (RTCHitN)auVar158[4];
                        local_2c0[5] = (RTCHitN)auVar158[5];
                        local_2c0[6] = (RTCHitN)auVar158[6];
                        local_2c0[7] = (RTCHitN)auVar158[7];
                        local_2c0[8] = (RTCHitN)auVar158[8];
                        local_2c0[9] = (RTCHitN)auVar158[9];
                        local_2c0[10] = (RTCHitN)auVar158[10];
                        local_2c0[0xb] = (RTCHitN)auVar158[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar158[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar158[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar158[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar158[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar158[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar158[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar158[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar158[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar158[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar158[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar158[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar158[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar158[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar158[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar158[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar158[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar158[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar158[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar158[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar158[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar158[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar158[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar158[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar158[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar158[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar158[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar158[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar158[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar158[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar158[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar158[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar158[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar158[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar158[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar158[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar158[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar158[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar158[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar158[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar158[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar158[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar158[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar158[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar158[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar158[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar158[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar158[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar158[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar158[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar158[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar158[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar158[0x3f];
                        local_280 = auVar200;
                        local_180 = local_400._0_8_;
                        uStack_178 = local_400._8_8_;
                        uStack_170 = local_400._16_8_;
                        uStack_168 = local_400._24_8_;
                        uStack_160 = local_400._32_8_;
                        uStack_158 = local_400._40_8_;
                        uStack_150 = local_400._48_8_;
                        uStack_148 = local_400._56_8_;
                        auVar158 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar158);
                        auVar100 = vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
                        local_828[3] = auVar100;
                        local_828[2] = auVar100;
                        local_828[1] = auVar100;
                        *local_828 = auVar100;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instPrimID[0]))
                        ;
                        auVar158 = vmovdqa64_avx512f(local_300);
                        local_780 = vmovdqa64_avx512f(auVar158);
                        local_858.valid = (int *)local_780;
                        local_858.geometryUserPtr = pGVar83->userPtr;
                        local_858.hit = local_2c0;
                        local_858.N = 0x10;
                        local_800 = auVar227._0_32_;
                        local_858.ray = (RTCRayN *)ray;
                        if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*pGVar83->intersectionFilterN)(&local_858);
                          auVar211 = ZEXT3264(local_480._0_32_);
                          auVar227 = ZEXT3264(local_800);
                          auVar158 = vmovdqa64_avx512f(local_780);
                          pGVar83 = (Geometry *)local_820._0_8_;
                        }
                        uVar30 = vptestmd_avx512f(auVar158,auVar158);
                        if ((short)uVar30 == 0) {
LAB_01aa4704:
                          *(int *)(ray + k * 4 + 0x200) = auVar227._0_4_;
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar200 = ZEXT1664(auVar200._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            (*p_Var9)(&local_858);
                            auVar211 = ZEXT3264(local_480._0_32_);
                            auVar227 = ZEXT3264(local_800);
                            auVar158 = vmovdqa64_avx512f(local_780);
                            pGVar83 = (Geometry *)local_820._0_8_;
                          }
                          uVar32 = vptestmd_avx512f(auVar158,auVar158);
                          if ((short)uVar32 == 0) goto LAB_01aa4704;
                          iVar1 = *(int *)(local_858.hit + 4);
                          iVar2 = *(int *)(local_858.hit + 8);
                          iVar61 = *(int *)(local_858.hit + 0xc);
                          iVar62 = *(int *)(local_858.hit + 0x10);
                          iVar63 = *(int *)(local_858.hit + 0x14);
                          iVar64 = *(int *)(local_858.hit + 0x18);
                          iVar65 = *(int *)(local_858.hit + 0x1c);
                          iVar66 = *(int *)(local_858.hit + 0x20);
                          iVar67 = *(int *)(local_858.hit + 0x24);
                          iVar68 = *(int *)(local_858.hit + 0x28);
                          iVar69 = *(int *)(local_858.hit + 0x2c);
                          iVar70 = *(int *)(local_858.hit + 0x30);
                          iVar71 = *(int *)(local_858.hit + 0x34);
                          iVar72 = *(int *)(local_858.hit + 0x38);
                          iVar73 = *(int *)(local_858.hit + 0x3c);
                          bVar86 = (byte)uVar32;
                          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                          bVar76 = (byte)(uVar32 >> 8);
                          bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                          bVar23 = SUB81(uVar32 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x300) =
                               (uint)(bVar86 & 1) * *(int *)local_858.hit |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x300);
                          *(uint *)(local_858.ray + 0x304) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_858.ray + 0x304);
                          *(uint *)(local_858.ray + 0x308) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_858.ray + 0x308);
                          *(uint *)(local_858.ray + 0x30c) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_858.ray + 0x30c);
                          *(uint *)(local_858.ray + 0x310) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_858.ray + 0x310);
                          *(uint *)(local_858.ray + 0x314) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_858.ray + 0x314);
                          *(uint *)(local_858.ray + 0x318) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x318);
                          *(uint *)(local_858.ray + 0x31c) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x31c);
                          *(uint *)(local_858.ray + 800) =
                               (uint)(bVar76 & 1) * iVar66 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 800);
                          *(uint *)(local_858.ray + 0x324) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x324);
                          *(uint *)(local_858.ray + 0x328) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x328);
                          *(uint *)(local_858.ray + 0x32c) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x32c);
                          *(uint *)(local_858.ray + 0x330) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x330);
                          *(uint *)(local_858.ray + 0x334) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x334);
                          *(uint *)(local_858.ray + 0x338) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x338);
                          *(uint *)(local_858.ray + 0x33c) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x33c);
                          iVar1 = *(int *)(local_858.hit + 0x44);
                          iVar2 = *(int *)(local_858.hit + 0x48);
                          iVar61 = *(int *)(local_858.hit + 0x4c);
                          iVar62 = *(int *)(local_858.hit + 0x50);
                          iVar63 = *(int *)(local_858.hit + 0x54);
                          iVar64 = *(int *)(local_858.hit + 0x58);
                          iVar65 = *(int *)(local_858.hit + 0x5c);
                          iVar66 = *(int *)(local_858.hit + 0x60);
                          iVar67 = *(int *)(local_858.hit + 100);
                          iVar68 = *(int *)(local_858.hit + 0x68);
                          iVar69 = *(int *)(local_858.hit + 0x6c);
                          iVar70 = *(int *)(local_858.hit + 0x70);
                          iVar71 = *(int *)(local_858.hit + 0x74);
                          iVar72 = *(int *)(local_858.hit + 0x78);
                          iVar73 = *(int *)(local_858.hit + 0x7c);
                          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                          bVar23 = SUB81(uVar32 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x340) =
                               (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x40) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x340);
                          *(uint *)(local_858.ray + 0x344) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_858.ray + 0x344);
                          *(uint *)(local_858.ray + 0x348) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_858.ray + 0x348);
                          *(uint *)(local_858.ray + 0x34c) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_858.ray + 0x34c);
                          *(uint *)(local_858.ray + 0x350) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_858.ray + 0x350);
                          *(uint *)(local_858.ray + 0x354) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_858.ray + 0x354);
                          *(uint *)(local_858.ray + 0x358) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x358);
                          *(uint *)(local_858.ray + 0x35c) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x35c);
                          *(uint *)(local_858.ray + 0x360) =
                               (uint)(bVar76 & 1) * iVar66 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x360);
                          *(uint *)(local_858.ray + 0x364) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x364);
                          *(uint *)(local_858.ray + 0x368) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x368);
                          *(uint *)(local_858.ray + 0x36c) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x36c);
                          *(uint *)(local_858.ray + 0x370) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x370);
                          *(uint *)(local_858.ray + 0x374) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x374);
                          *(uint *)(local_858.ray + 0x378) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x378);
                          *(uint *)(local_858.ray + 0x37c) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x37c);
                          iVar1 = *(int *)(local_858.hit + 0x84);
                          iVar2 = *(int *)(local_858.hit + 0x88);
                          iVar61 = *(int *)(local_858.hit + 0x8c);
                          iVar62 = *(int *)(local_858.hit + 0x90);
                          iVar63 = *(int *)(local_858.hit + 0x94);
                          iVar64 = *(int *)(local_858.hit + 0x98);
                          iVar65 = *(int *)(local_858.hit + 0x9c);
                          iVar66 = *(int *)(local_858.hit + 0xa0);
                          iVar67 = *(int *)(local_858.hit + 0xa4);
                          iVar68 = *(int *)(local_858.hit + 0xa8);
                          iVar69 = *(int *)(local_858.hit + 0xac);
                          iVar70 = *(int *)(local_858.hit + 0xb0);
                          iVar71 = *(int *)(local_858.hit + 0xb4);
                          iVar72 = *(int *)(local_858.hit + 0xb8);
                          iVar73 = *(int *)(local_858.hit + 0xbc);
                          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                          bVar23 = SUB81(uVar32 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x380) =
                               (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x80) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x380);
                          *(uint *)(local_858.ray + 900) =
                               (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_858.ray + 900);
                          *(uint *)(local_858.ray + 0x388) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_858.ray + 0x388);
                          *(uint *)(local_858.ray + 0x38c) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_858.ray + 0x38c);
                          *(uint *)(local_858.ray + 0x390) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_858.ray + 0x390);
                          *(uint *)(local_858.ray + 0x394) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_858.ray + 0x394);
                          *(uint *)(local_858.ray + 0x398) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x398);
                          *(uint *)(local_858.ray + 0x39c) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x39c);
                          *(uint *)(local_858.ray + 0x3a0) =
                               (uint)(bVar76 & 1) * iVar66 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x3a0);
                          *(uint *)(local_858.ray + 0x3a4) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x3a4);
                          *(uint *)(local_858.ray + 0x3a8) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x3a8);
                          *(uint *)(local_858.ray + 0x3ac) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x3ac);
                          *(uint *)(local_858.ray + 0x3b0) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x3b0);
                          *(uint *)(local_858.ray + 0x3b4) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x3b4);
                          *(uint *)(local_858.ray + 0x3b8) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x3b8);
                          *(uint *)(local_858.ray + 0x3bc) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x3bc);
                          iVar1 = *(int *)(local_858.hit + 0xc4);
                          iVar2 = *(int *)(local_858.hit + 200);
                          iVar61 = *(int *)(local_858.hit + 0xcc);
                          iVar62 = *(int *)(local_858.hit + 0xd0);
                          iVar63 = *(int *)(local_858.hit + 0xd4);
                          iVar64 = *(int *)(local_858.hit + 0xd8);
                          iVar65 = *(int *)(local_858.hit + 0xdc);
                          iVar66 = *(int *)(local_858.hit + 0xe0);
                          iVar67 = *(int *)(local_858.hit + 0xe4);
                          iVar68 = *(int *)(local_858.hit + 0xe8);
                          iVar69 = *(int *)(local_858.hit + 0xec);
                          iVar70 = *(int *)(local_858.hit + 0xf0);
                          iVar71 = *(int *)(local_858.hit + 0xf4);
                          iVar72 = *(int *)(local_858.hit + 0xf8);
                          iVar73 = *(int *)(local_858.hit + 0xfc);
                          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                          bVar23 = SUB81(uVar32 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x3c0) =
                               (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0xc0) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x3c0);
                          *(uint *)(local_858.ray + 0x3c4) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_858.ray + 0x3c4);
                          *(uint *)(local_858.ray + 0x3c8) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_858.ray + 0x3c8);
                          *(uint *)(local_858.ray + 0x3cc) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_858.ray + 0x3cc);
                          *(uint *)(local_858.ray + 0x3d0) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_858.ray + 0x3d0);
                          *(uint *)(local_858.ray + 0x3d4) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_858.ray + 0x3d4);
                          *(uint *)(local_858.ray + 0x3d8) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x3d8);
                          *(uint *)(local_858.ray + 0x3dc) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x3dc);
                          *(uint *)(local_858.ray + 0x3e0) =
                               (uint)(bVar76 & 1) * iVar66 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x3e0);
                          *(uint *)(local_858.ray + 0x3e4) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x3e4);
                          *(uint *)(local_858.ray + 1000) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 1000);
                          *(uint *)(local_858.ray + 0x3ec) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x3ec);
                          *(uint *)(local_858.ray + 0x3f0) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x3f0);
                          *(uint *)(local_858.ray + 0x3f4) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x3f4);
                          *(uint *)(local_858.ray + 0x3f8) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x3f8);
                          *(uint *)(local_858.ray + 0x3fc) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x3fc);
                          iVar1 = *(int *)(local_858.hit + 0x104);
                          iVar2 = *(int *)(local_858.hit + 0x108);
                          iVar61 = *(int *)(local_858.hit + 0x10c);
                          iVar62 = *(int *)(local_858.hit + 0x110);
                          iVar63 = *(int *)(local_858.hit + 0x114);
                          iVar64 = *(int *)(local_858.hit + 0x118);
                          iVar65 = *(int *)(local_858.hit + 0x11c);
                          iVar66 = *(int *)(local_858.hit + 0x120);
                          iVar67 = *(int *)(local_858.hit + 0x124);
                          iVar68 = *(int *)(local_858.hit + 0x128);
                          iVar69 = *(int *)(local_858.hit + 300);
                          iVar70 = *(int *)(local_858.hit + 0x130);
                          iVar71 = *(int *)(local_858.hit + 0x134);
                          iVar72 = *(int *)(local_858.hit + 0x138);
                          iVar73 = *(int *)(local_858.hit + 0x13c);
                          bVar10 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar32 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar32 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar32 >> 6) & 1);
                          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
                          bVar17 = (bool)((byte)(uVar32 >> 9) & 1);
                          bVar18 = (bool)((byte)(uVar32 >> 10) & 1);
                          bVar19 = (bool)((byte)(uVar32 >> 0xb) & 1);
                          bVar20 = (bool)((byte)(uVar32 >> 0xc) & 1);
                          bVar21 = (bool)((byte)(uVar32 >> 0xd) & 1);
                          bVar22 = (bool)((byte)(uVar32 >> 0xe) & 1);
                          bVar23 = SUB81(uVar32 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x400) =
                               (uint)(bVar86 & 1) * *(int *)(local_858.hit + 0x100) |
                               (uint)!(bool)(bVar86 & 1) * *(int *)(local_858.ray + 0x400);
                          *(uint *)(local_858.ray + 0x404) =
                               (uint)bVar10 * iVar1 |
                               (uint)!bVar10 * *(int *)(local_858.ray + 0x404);
                          *(uint *)(local_858.ray + 0x408) =
                               (uint)bVar11 * iVar2 |
                               (uint)!bVar11 * *(int *)(local_858.ray + 0x408);
                          *(uint *)(local_858.ray + 0x40c) =
                               (uint)bVar12 * iVar61 |
                               (uint)!bVar12 * *(int *)(local_858.ray + 0x40c);
                          *(uint *)(local_858.ray + 0x410) =
                               (uint)bVar13 * iVar62 |
                               (uint)!bVar13 * *(int *)(local_858.ray + 0x410);
                          *(uint *)(local_858.ray + 0x414) =
                               (uint)bVar14 * iVar63 |
                               (uint)!bVar14 * *(int *)(local_858.ray + 0x414);
                          *(uint *)(local_858.ray + 0x418) =
                               (uint)bVar15 * iVar64 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x418);
                          *(uint *)(local_858.ray + 0x41c) =
                               (uint)bVar16 * iVar65 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x41c);
                          *(uint *)(local_858.ray + 0x420) =
                               (uint)(bVar76 & 1) * iVar66 |
                               (uint)!(bool)(bVar76 & 1) * *(int *)(local_858.ray + 0x420);
                          *(uint *)(local_858.ray + 0x424) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x424);
                          *(uint *)(local_858.ray + 0x428) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x428);
                          *(uint *)(local_858.ray + 0x42c) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x42c);
                          *(uint *)(local_858.ray + 0x430) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x430);
                          *(uint *)(local_858.ray + 0x434) =
                               (uint)bVar21 * iVar71 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x434);
                          *(uint *)(local_858.ray + 0x438) =
                               (uint)bVar22 * iVar72 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x438);
                          *(uint *)(local_858.ray + 0x43c) =
                               (uint)bVar23 * iVar73 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x43c);
                          auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x140)
                                                      );
                          auVar158 = vmovdqu32_avx512f(auVar158);
                          *(undefined1 (*) [64])(local_858.ray + 0x440) = auVar158;
                          auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x180)
                                                      );
                          auVar158 = vmovdqu32_avx512f(auVar158);
                          *(undefined1 (*) [64])(local_858.ray + 0x480) = auVar158;
                          auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x1c0)
                                                      );
                          auVar158 = vmovdqa32_avx512f(auVar158);
                          *(undefined1 (*) [64])(local_858.ray + 0x4c0) = auVar158;
                          auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x200)
                                                      );
                          auVar158 = vmovdqa32_avx512f(auVar158);
                          *(undefined1 (*) [64])(local_858.ray + 0x500) = auVar158;
                          auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar86 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & (byte)uVar87;
                        uVar144 = auVar227._0_4_;
                        auVar154._4_4_ = uVar144;
                        auVar154._0_4_ = uVar144;
                        auVar154._8_4_ = uVar144;
                        auVar154._12_4_ = uVar144;
                        auVar154._16_4_ = uVar144;
                        auVar154._20_4_ = uVar144;
                        auVar154._24_4_ = uVar144;
                        auVar154._28_4_ = uVar144;
                        uVar30 = vcmpps_avx512vl(auVar211._0_32_,auVar154,2);
                        if ((bVar86 & (byte)uVar30) == 0) goto LAB_01aa4798;
                        bVar86 = bVar86 & (byte)uVar30;
                        uVar87 = (ulong)bVar86;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar100 = vblendmps_avx512vl(auVar155,auVar211._0_32_);
                        auVar136._0_4_ =
                             (uint)(bVar86 & 1) * auVar100._0_4_ |
                             (uint)!(bool)(bVar86 & 1) * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 1 & 1);
                        auVar136._4_4_ = (uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 2 & 1);
                        auVar136._8_4_ = (uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 3 & 1);
                        auVar136._12_4_ =
                             (uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 4 & 1);
                        auVar136._16_4_ =
                             (uint)bVar10 * auVar100._16_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 5 & 1);
                        auVar136._20_4_ =
                             (uint)bVar10 * auVar100._20_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar86 >> 6 & 1);
                        auVar136._24_4_ =
                             (uint)bVar10 * auVar100._24_4_ | (uint)!bVar10 * 0x7f800000;
                        auVar136._28_4_ =
                             (uint)(bVar86 >> 7) * auVar100._28_4_ |
                             (uint)!(bool)(bVar86 >> 7) * 0x7f800000;
                        auVar100 = vshufps_avx(auVar136,auVar136,0xb1);
                        auVar100 = vminps_avx(auVar136,auVar100);
                        auVar114 = vshufpd_avx(auVar100,auVar100,5);
                        auVar100 = vminps_avx(auVar100,auVar114);
                        auVar114 = vpermpd_avx2(auVar100,0x4e);
                        auVar100 = vminps_avx(auVar100,auVar114);
                        uVar30 = vcmpps_avx512vl(auVar136,auVar100,0);
                        bVar76 = (byte)uVar30 & bVar86;
                        if (bVar76 != 0) {
                          bVar86 = bVar76;
                        }
                        uVar79 = 0;
                        for (uVar80 = (uint)bVar86; (uVar80 & 1) == 0;
                            uVar80 = uVar80 >> 1 | 0x80000000) {
                          uVar79 = uVar79 + 1;
                        }
                        uVar77 = (ulong)uVar79;
                      } while( true );
                    }
                    fVar166 = local_560[uVar77];
                    uVar144 = *(undefined4 *)(local_540 + uVar77 * 4);
                    fVar214 = 1.0 - fVar166;
                    fVar213 = fVar214 * fVar214 * -3.0;
                    auVar200 = ZEXT464((uint)fVar213);
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214)),
                                              ZEXT416((uint)(fVar166 * fVar214)),ZEXT416(0xc0000000)
                                             );
                    auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar166 * fVar214)),
                                              ZEXT416((uint)(fVar166 * fVar166)),ZEXT416(0x40000000)
                                             );
                    fVar214 = auVar92._0_4_ * 3.0;
                    fVar162 = auVar97._0_4_ * 3.0;
                    fVar179 = fVar166 * fVar166 * 3.0;
                    auVar203._0_4_ = fVar179 * fVar159;
                    auVar203._4_4_ = fVar179 * fVar160;
                    auVar203._8_4_ = fVar179 * fVar161;
                    auVar203._12_4_ = fVar179 * fVar75;
                    auVar206 = ZEXT1664(auVar203);
                    auVar175._4_4_ = fVar162;
                    auVar175._0_4_ = fVar162;
                    auVar175._8_4_ = fVar162;
                    auVar175._12_4_ = fVar162;
                    auVar92 = vfmadd132ps_fma(auVar175,auVar203,auVar25);
                    auVar183._4_4_ = fVar214;
                    auVar183._0_4_ = fVar214;
                    auVar183._8_4_ = fVar214;
                    auVar183._12_4_ = fVar214;
                    auVar92 = vfmadd132ps_fma(auVar183,auVar92,auVar145);
                    auVar176._4_4_ = fVar213;
                    auVar176._0_4_ = fVar213;
                    auVar176._8_4_ = fVar213;
                    auVar176._12_4_ = fVar213;
                    auVar92 = vfmadd132ps_fma(auVar176,auVar92,auVar94);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_520 + uVar77 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar92._0_4_;
                    uVar8 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                    uVar8 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar144;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar84;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01aa43c9;
      }
LAB_01aa3a70:
      uVar144 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar33._4_4_ = uVar144;
      auVar33._0_4_ = uVar144;
      auVar33._8_4_ = uVar144;
      auVar33._12_4_ = uVar144;
      uVar30 = vcmpps_avx512vl(local_4f0,auVar33,2);
      uVar84 = (uint)uVar85 & (uint)uVar85 + 0xf & (uint)uVar30;
      uVar85 = (ulong)uVar84;
    } while (uVar84 != 0);
  }
  return;
LAB_01aa4798:
  auVar100 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar158 = ZEXT3264(auVar100);
  auVar100 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar229 = ZEXT3264(auVar100);
  auVar228 = ZEXT3264(local_7e0);
  auVar100 = vmovdqa64_avx512vl(local_3c0);
  auVar230 = ZEXT3264(auVar100);
LAB_01aa43c9:
  lVar82 = lVar82 + 8;
  if (iVar7 <= (int)lVar82) goto LAB_01aa3a70;
  goto LAB_01aa3b19;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }